

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  ulong uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  byte bVar101;
  ulong uVar102;
  uint uVar103;
  uint uVar104;
  long lVar105;
  long lVar106;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  Geometry *pGVar107;
  undefined8 unaff_R13;
  ulong uVar108;
  ulong uVar109;
  long lVar110;
  size_t sVar111;
  byte bVar112;
  float fVar113;
  float fVar166;
  float fVar168;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar121 [16];
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar172;
  float fVar173;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  float fVar174;
  undefined4 uVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar187;
  float fVar188;
  undefined1 auVar186 [64];
  undefined1 auVar189 [32];
  float fVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar211;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [64];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [64];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  RTCFilterFunctionNArguments local_840;
  undefined1 local_810 [16];
  size_t local_7f8;
  undefined1 (*local_7f0) [32];
  long local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined4 uStack_710;
  undefined4 uStack_70c;
  undefined4 uStack_708;
  undefined4 uStack_704;
  undefined1 local_700 [64];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined4 uStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  int local_53c;
  undefined1 local_530 [16];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar102 = (ulong)(byte)prim[1];
  fVar190 = *(float *)(prim + uVar102 * 0x19 + 0x12);
  auVar32 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar119 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar118 = vinsertps_avx(auVar119,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar206 = vsubps_avx(auVar32,*(undefined1 (*) [16])(prim + uVar102 * 0x19 + 6));
  fVar195 = fVar190 * auVar206._0_4_;
  fVar174 = fVar190 * auVar118._0_4_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar102 * 4 + 6);
  auVar128 = vpmovsxbd_avx2(auVar32);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar102 * 5 + 6);
  auVar126 = vpmovsxbd_avx2(auVar119);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar102 * 6 + 6);
  auVar127 = vpmovsxbd_avx2(auVar120);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar102 * 0xb + 6);
  auVar139 = vpmovsxbd_avx2(auVar176);
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar102 * 0xc + 6);
  auVar138 = vpmovsxbd_avx2(auVar8);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar102 * 0xd + 6);
  auVar129 = vpmovsxbd_avx2(auVar9);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar102 * 0x12 + 6);
  auVar130 = vpmovsxbd_avx2(auVar10);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar102 * 0x13 + 6);
  auVar137 = vpmovsxbd_avx2(auVar11);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar102 * 0x14 + 6);
  auVar132 = vpmovsxbd_avx2(auVar12);
  auVar131 = vcvtdq2ps_avx(auVar132);
  auVar234._4_4_ = fVar174;
  auVar234._0_4_ = fVar174;
  auVar234._8_4_ = fVar174;
  auVar234._12_4_ = fVar174;
  auVar234._16_4_ = fVar174;
  auVar234._20_4_ = fVar174;
  auVar234._24_4_ = fVar174;
  auVar234._28_4_ = fVar174;
  auVar236._8_4_ = 1;
  auVar236._0_8_ = 0x100000001;
  auVar236._12_4_ = 1;
  auVar236._16_4_ = 1;
  auVar236._20_4_ = 1;
  auVar236._24_4_ = 1;
  auVar236._28_4_ = 1;
  auVar122 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar125 = ZEXT1632(CONCAT412(fVar190 * auVar118._12_4_,
                                CONCAT48(fVar190 * auVar118._8_4_,
                                         CONCAT44(fVar190 * auVar118._4_4_,fVar174))));
  auVar124 = vpermps_avx2(auVar236,auVar125);
  auVar123 = vpermps_avx512vl(auVar122,auVar125);
  fVar174 = auVar123._0_4_;
  auVar186._0_4_ = fVar174 * auVar127._0_4_;
  fVar187 = auVar123._4_4_;
  auVar186._4_4_ = fVar187 * auVar127._4_4_;
  fVar188 = auVar123._8_4_;
  auVar186._8_4_ = fVar188 * auVar127._8_4_;
  fVar197 = auVar123._12_4_;
  auVar186._12_4_ = fVar197 * auVar127._12_4_;
  fVar196 = auVar123._16_4_;
  auVar186._16_4_ = fVar196 * auVar127._16_4_;
  fVar211 = auVar123._20_4_;
  auVar186._20_4_ = fVar211 * auVar127._20_4_;
  fVar113 = auVar123._24_4_;
  auVar186._28_36_ = in_ZMM4._28_36_;
  auVar186._24_4_ = fVar113 * auVar127._24_4_;
  auVar125._4_4_ = auVar129._4_4_ * fVar187;
  auVar125._0_4_ = auVar129._0_4_ * fVar174;
  auVar125._8_4_ = auVar129._8_4_ * fVar188;
  auVar125._12_4_ = auVar129._12_4_ * fVar197;
  auVar125._16_4_ = auVar129._16_4_ * fVar196;
  auVar125._20_4_ = auVar129._20_4_ * fVar211;
  auVar125._24_4_ = auVar129._24_4_ * fVar113;
  auVar125._28_4_ = auVar132._28_4_;
  auVar132._4_4_ = auVar131._4_4_ * fVar187;
  auVar132._0_4_ = auVar131._0_4_ * fVar174;
  auVar132._8_4_ = auVar131._8_4_ * fVar188;
  auVar132._12_4_ = auVar131._12_4_ * fVar197;
  auVar132._16_4_ = auVar131._16_4_ * fVar196;
  auVar132._20_4_ = auVar131._20_4_ * fVar211;
  auVar132._24_4_ = auVar131._24_4_ * fVar113;
  auVar132._28_4_ = auVar123._28_4_;
  auVar32 = vfmadd231ps_fma(auVar186._0_32_,auVar124,auVar126);
  auVar119 = vfmadd231ps_fma(auVar125,auVar124,auVar138);
  auVar120 = vfmadd231ps_fma(auVar132,auVar137,auVar124);
  auVar32 = vfmadd231ps_fma(ZEXT1632(auVar32),auVar234,auVar128);
  auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar234,auVar139);
  auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar130,auVar234);
  auVar235._4_4_ = fVar195;
  auVar235._0_4_ = fVar195;
  auVar235._8_4_ = fVar195;
  auVar235._12_4_ = fVar195;
  auVar235._16_4_ = fVar195;
  auVar235._20_4_ = fVar195;
  auVar235._24_4_ = fVar195;
  auVar235._28_4_ = fVar195;
  auVar124 = ZEXT1632(CONCAT412(fVar190 * auVar206._12_4_,
                                CONCAT48(fVar190 * auVar206._8_4_,
                                         CONCAT44(fVar190 * auVar206._4_4_,fVar195))));
  auVar132 = vpermps_avx2(auVar236,auVar124);
  auVar124 = vpermps_avx512vl(auVar122,auVar124);
  auVar125 = vmulps_avx512vl(auVar124,auVar127);
  auVar134._0_4_ = auVar124._0_4_ * auVar129._0_4_;
  auVar134._4_4_ = auVar124._4_4_ * auVar129._4_4_;
  auVar134._8_4_ = auVar124._8_4_ * auVar129._8_4_;
  auVar134._12_4_ = auVar124._12_4_ * auVar129._12_4_;
  auVar134._16_4_ = auVar124._16_4_ * auVar129._16_4_;
  auVar134._20_4_ = auVar124._20_4_ * auVar129._20_4_;
  auVar134._24_4_ = auVar124._24_4_ * auVar129._24_4_;
  auVar134._28_4_ = 0;
  auVar129._4_4_ = auVar124._4_4_ * auVar131._4_4_;
  auVar129._0_4_ = auVar124._0_4_ * auVar131._0_4_;
  auVar129._8_4_ = auVar124._8_4_ * auVar131._8_4_;
  auVar129._12_4_ = auVar124._12_4_ * auVar131._12_4_;
  auVar129._16_4_ = auVar124._16_4_ * auVar131._16_4_;
  auVar129._20_4_ = auVar124._20_4_ * auVar131._20_4_;
  auVar129._24_4_ = auVar124._24_4_ * auVar131._24_4_;
  auVar129._28_4_ = auVar127._28_4_;
  auVar126 = vfmadd231ps_avx512vl(auVar125,auVar132,auVar126);
  auVar176 = vfmadd231ps_fma(auVar134,auVar132,auVar138);
  auVar8 = vfmadd231ps_fma(auVar129,auVar132,auVar137);
  auVar126 = vfmadd231ps_avx512vl(auVar126,auVar235,auVar128);
  auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar235,auVar139);
  auVar224._8_4_ = 0x7fffffff;
  auVar224._0_8_ = 0x7fffffff7fffffff;
  auVar224._12_4_ = 0x7fffffff;
  auVar224._16_4_ = 0x7fffffff;
  auVar224._20_4_ = 0x7fffffff;
  auVar224._24_4_ = 0x7fffffff;
  auVar224._28_4_ = 0x7fffffff;
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar235,auVar130);
  auVar128 = vandps_avx(ZEXT1632(auVar32),auVar224);
  auVar136._8_4_ = 0x219392ef;
  auVar136._0_8_ = 0x219392ef219392ef;
  auVar136._12_4_ = 0x219392ef;
  auVar136._16_4_ = 0x219392ef;
  auVar136._20_4_ = 0x219392ef;
  auVar136._24_4_ = 0x219392ef;
  auVar136._28_4_ = 0x219392ef;
  uVar108 = vcmpps_avx512vl(auVar128,auVar136,1);
  bVar18 = (bool)((byte)uVar108 & 1);
  auVar124._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar32._0_4_;
  bVar18 = (bool)((byte)(uVar108 >> 1) & 1);
  auVar124._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar32._4_4_;
  bVar18 = (bool)((byte)(uVar108 >> 2) & 1);
  auVar124._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar32._8_4_;
  bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
  auVar124._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar32._12_4_;
  auVar124._16_4_ = (uint)((byte)(uVar108 >> 4) & 1) * 0x219392ef;
  auVar124._20_4_ = (uint)((byte)(uVar108 >> 5) & 1) * 0x219392ef;
  auVar124._24_4_ = (uint)((byte)(uVar108 >> 6) & 1) * 0x219392ef;
  auVar124._28_4_ = (uint)(byte)(uVar108 >> 7) * 0x219392ef;
  auVar128 = vandps_avx(ZEXT1632(auVar119),auVar224);
  uVar108 = vcmpps_avx512vl(auVar128,auVar136,1);
  bVar18 = (bool)((byte)uVar108 & 1);
  auVar122._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar119._0_4_;
  bVar18 = (bool)((byte)(uVar108 >> 1) & 1);
  auVar122._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar119._4_4_;
  bVar18 = (bool)((byte)(uVar108 >> 2) & 1);
  auVar122._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar119._8_4_;
  bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
  auVar122._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar119._12_4_;
  auVar122._16_4_ = (uint)((byte)(uVar108 >> 4) & 1) * 0x219392ef;
  auVar122._20_4_ = (uint)((byte)(uVar108 >> 5) & 1) * 0x219392ef;
  auVar122._24_4_ = (uint)((byte)(uVar108 >> 6) & 1) * 0x219392ef;
  auVar122._28_4_ = (uint)(byte)(uVar108 >> 7) * 0x219392ef;
  auVar128 = vandps_avx(ZEXT1632(auVar120),auVar224);
  uVar108 = vcmpps_avx512vl(auVar128,auVar136,1);
  bVar18 = (bool)((byte)uVar108 & 1);
  auVar128._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar120._0_4_;
  bVar18 = (bool)((byte)(uVar108 >> 1) & 1);
  auVar128._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar120._4_4_;
  bVar18 = (bool)((byte)(uVar108 >> 2) & 1);
  auVar128._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar120._8_4_;
  bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
  auVar128._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar120._12_4_;
  auVar128._16_4_ = (uint)((byte)(uVar108 >> 4) & 1) * 0x219392ef;
  auVar128._20_4_ = (uint)((byte)(uVar108 >> 5) & 1) * 0x219392ef;
  auVar128._24_4_ = (uint)((byte)(uVar108 >> 6) & 1) * 0x219392ef;
  auVar128._28_4_ = (uint)(byte)(uVar108 >> 7) * 0x219392ef;
  auVar127 = vrcp14ps_avx512vl(auVar124);
  auVar223._8_4_ = 0x3f800000;
  auVar223._0_8_ = 0x3f8000003f800000;
  auVar223._12_4_ = 0x3f800000;
  auVar223._16_4_ = 0x3f800000;
  auVar223._20_4_ = 0x3f800000;
  auVar223._24_4_ = 0x3f800000;
  auVar223._28_4_ = 0x3f800000;
  auVar32 = vfnmadd213ps_fma(auVar124,auVar127,auVar223);
  auVar32 = vfmadd132ps_fma(ZEXT1632(auVar32),auVar127,auVar127);
  auVar127 = vrcp14ps_avx512vl(auVar122);
  auVar119 = vfnmadd213ps_fma(auVar122,auVar127,auVar223);
  auVar119 = vfmadd132ps_fma(ZEXT1632(auVar119),auVar127,auVar127);
  auVar127 = vrcp14ps_avx512vl(auVar128);
  auVar120 = vfnmadd213ps_fma(auVar128,auVar127,auVar223);
  auVar120 = vfmadd132ps_fma(ZEXT1632(auVar120),auVar127,auVar127);
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 7 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx512vl(auVar128,auVar126);
  auVar130._4_4_ = auVar32._4_4_ * auVar128._4_4_;
  auVar130._0_4_ = auVar32._0_4_ * auVar128._0_4_;
  auVar130._8_4_ = auVar32._8_4_ * auVar128._8_4_;
  auVar130._12_4_ = auVar32._12_4_ * auVar128._12_4_;
  auVar130._16_4_ = auVar128._16_4_ * 0.0;
  auVar130._20_4_ = auVar128._20_4_ * 0.0;
  auVar130._24_4_ = auVar128._24_4_ * 0.0;
  auVar130._28_4_ = auVar128._28_4_;
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 9 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx512vl(auVar128,auVar126);
  auVar135._0_4_ = auVar32._0_4_ * auVar128._0_4_;
  auVar135._4_4_ = auVar32._4_4_ * auVar128._4_4_;
  auVar135._8_4_ = auVar32._8_4_ * auVar128._8_4_;
  auVar135._12_4_ = auVar32._12_4_ * auVar128._12_4_;
  auVar135._16_4_ = auVar128._16_4_ * 0.0;
  auVar135._20_4_ = auVar128._20_4_ * 0.0;
  auVar135._24_4_ = auVar128._24_4_ * 0.0;
  auVar135._28_4_ = 0;
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0xe + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar176));
  auVar137._4_4_ = auVar119._4_4_ * auVar128._4_4_;
  auVar137._0_4_ = auVar119._0_4_ * auVar128._0_4_;
  auVar137._8_4_ = auVar119._8_4_ * auVar128._8_4_;
  auVar137._12_4_ = auVar119._12_4_ * auVar128._12_4_;
  auVar137._16_4_ = auVar128._16_4_ * 0.0;
  auVar137._20_4_ = auVar128._20_4_ * 0.0;
  auVar137._24_4_ = auVar128._24_4_ * 0.0;
  auVar137._28_4_ = auVar128._28_4_;
  auVar129 = vpbroadcastd_avx512vl();
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar176));
  auVar133._0_4_ = auVar119._0_4_ * auVar128._0_4_;
  auVar133._4_4_ = auVar119._4_4_ * auVar128._4_4_;
  auVar133._8_4_ = auVar119._8_4_ * auVar128._8_4_;
  auVar133._12_4_ = auVar119._12_4_ * auVar128._12_4_;
  auVar133._16_4_ = auVar128._16_4_ * 0.0;
  auVar133._20_4_ = auVar128._20_4_ * 0.0;
  auVar133._24_4_ = auVar128._24_4_ * 0.0;
  auVar133._28_4_ = 0;
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x15 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar8));
  auVar131._4_4_ = auVar128._4_4_ * auVar120._4_4_;
  auVar131._0_4_ = auVar128._0_4_ * auVar120._0_4_;
  auVar131._8_4_ = auVar128._8_4_ * auVar120._8_4_;
  auVar131._12_4_ = auVar128._12_4_ * auVar120._12_4_;
  auVar131._16_4_ = auVar128._16_4_ * 0.0;
  auVar131._20_4_ = auVar128._20_4_ * 0.0;
  auVar131._24_4_ = auVar128._24_4_ * 0.0;
  auVar131._28_4_ = auVar128._28_4_;
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x17 + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar128 = vsubps_avx(auVar128,ZEXT1632(auVar8));
  auVar123._0_4_ = auVar120._0_4_ * auVar128._0_4_;
  auVar123._4_4_ = auVar120._4_4_ * auVar128._4_4_;
  auVar123._8_4_ = auVar120._8_4_ * auVar128._8_4_;
  auVar123._12_4_ = auVar120._12_4_ * auVar128._12_4_;
  auVar123._16_4_ = auVar128._16_4_ * 0.0;
  auVar123._20_4_ = auVar128._20_4_ * 0.0;
  auVar123._24_4_ = auVar128._24_4_ * 0.0;
  auVar123._28_4_ = 0;
  auVar128 = vpminsd_avx2(auVar130,auVar135);
  auVar126 = vpminsd_avx2(auVar137,auVar133);
  auVar128 = vmaxps_avx(auVar128,auVar126);
  auVar126 = vpminsd_avx2(auVar131,auVar123);
  uVar175 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar127._4_4_ = uVar175;
  auVar127._0_4_ = uVar175;
  auVar127._8_4_ = uVar175;
  auVar127._12_4_ = uVar175;
  auVar127._16_4_ = uVar175;
  auVar127._20_4_ = uVar175;
  auVar127._24_4_ = uVar175;
  auVar127._28_4_ = uVar175;
  auVar126 = vmaxps_avx512vl(auVar126,auVar127);
  auVar128 = vmaxps_avx(auVar128,auVar126);
  auVar126._8_4_ = 0x3f7ffffa;
  auVar126._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar126._12_4_ = 0x3f7ffffa;
  auVar126._16_4_ = 0x3f7ffffa;
  auVar126._20_4_ = 0x3f7ffffa;
  auVar126._24_4_ = 0x3f7ffffa;
  auVar126._28_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar128,auVar126);
  auVar128 = vpmaxsd_avx2(auVar130,auVar135);
  auVar126 = vpmaxsd_avx2(auVar137,auVar133);
  auVar128 = vminps_avx(auVar128,auVar126);
  auVar126 = vpmaxsd_avx2(auVar131,auVar123);
  uVar175 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar139._4_4_ = uVar175;
  auVar139._0_4_ = uVar175;
  auVar139._8_4_ = uVar175;
  auVar139._12_4_ = uVar175;
  auVar139._16_4_ = uVar175;
  auVar139._20_4_ = uVar175;
  auVar139._24_4_ = uVar175;
  auVar139._28_4_ = uVar175;
  auVar126 = vminps_avx512vl(auVar126,auVar139);
  auVar128 = vminps_avx(auVar128,auVar126);
  auVar138._8_4_ = 0x3f800003;
  auVar138._0_8_ = 0x3f8000033f800003;
  auVar138._12_4_ = 0x3f800003;
  auVar138._16_4_ = 0x3f800003;
  auVar138._20_4_ = 0x3f800003;
  auVar138._24_4_ = 0x3f800003;
  auVar138._28_4_ = 0x3f800003;
  auVar128 = vmulps_avx512vl(auVar128,auVar138);
  uVar33 = vcmpps_avx512vl(local_3a0,auVar128,2);
  uVar37 = vpcmpgtd_avx512vl(auVar129,_DAT_01fb4ba0);
  uVar108 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar33 & (byte)uVar37));
  local_7f0 = (undefined1 (*) [32])local_100;
  auVar186 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar186);
  sVar111 = k;
  local_7f8 = k;
  do {
    auVar128 = local_7a0;
    if (uVar108 == 0) {
      return;
    }
    lVar105 = 0;
    for (uVar102 = uVar108; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
      lVar105 = lVar105 + 1;
    }
    uVar13 = *(uint *)(prim + 2);
    uVar14 = *(uint *)(prim + lVar105 * 4 + 6);
    pGVar107 = (context->scene->geometries).items[uVar13].ptr;
    uVar102 = (ulong)*(uint *)(*(long *)&pGVar107->field_0x58 +
                              pGVar107[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * (ulong)uVar14);
    p_Var17 = pGVar107[1].intersectionFilterN;
    lVar105 = *(long *)&pGVar107[1].time_range.upper;
    auVar32 = *(undefined1 (*) [16])(lVar105 + (long)p_Var17 * uVar102);
    pauVar3 = (undefined1 (*) [16])(lVar105 + (uVar102 + 1) * (long)p_Var17);
    uVar33 = *(undefined8 *)*pauVar3;
    uVar37 = *(undefined8 *)(*pauVar3 + 8);
    auVar12 = *pauVar3;
    auVar10 = *pauVar3;
    auVar8 = *pauVar3;
    auVar119 = *pauVar3;
    pauVar4 = (undefined1 (*) [16])(lVar105 + (uVar102 + 2) * (long)p_Var17);
    uVar95 = *(undefined8 *)*pauVar4;
    uVar96 = *(undefined8 *)(*pauVar4 + 8);
    auVar11 = *pauVar4;
    auVar9 = *pauVar4;
    auVar176 = *pauVar4;
    auVar120 = *pauVar4;
    uVar108 = uVar108 - 1 & uVar108;
    pauVar5 = (undefined1 (*) [12])(lVar105 + (uVar102 + 3) * (long)p_Var17);
    uVar97 = *(undefined8 *)*pauVar5;
    uVar98 = *(undefined8 *)(*pauVar5 + 8);
    local_8a0 = (float)uVar97;
    fStack_89c = (float)((ulong)uVar97 >> 0x20);
    fStack_898 = (float)uVar98;
    fStack_894 = (float)((ulong)uVar98 >> 0x20);
    if (uVar108 != 0) {
      uVar109 = uVar108 - 1 & uVar108;
      for (uVar102 = uVar108; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
      }
      if (uVar109 != 0) {
        for (; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar15 = (int)pGVar107[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar118 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar111 * 4)),
                             ZEXT416(*(uint *)(ray + sVar111 * 4 + 0x40)),0x1c);
    auVar118 = vinsertps_avx(auVar118,ZEXT416(*(uint *)(ray + sVar111 * 4 + 0x80)),0x28);
    auVar117 = vsubps_avx(auVar32,auVar118);
    uVar175 = auVar117._0_4_;
    auVar114._4_4_ = uVar175;
    auVar114._0_4_ = uVar175;
    auVar114._8_4_ = uVar175;
    auVar114._12_4_ = uVar175;
    auVar206 = vshufps_avx(auVar117,auVar117,0x55);
    aVar6 = pre->ray_space[k].vx.field_0;
    aVar7 = pre->ray_space[k].vy.field_0;
    auVar117 = vshufps_avx(auVar117,auVar117,0xaa);
    fVar190 = pre->ray_space[k].vz.field_0.m128[0];
    fVar174 = pre->ray_space[k].vz.field_0.m128[1];
    fVar187 = pre->ray_space[k].vz.field_0.m128[2];
    fVar188 = pre->ray_space[k].vz.field_0.m128[3];
    auVar226._0_4_ = fVar190 * auVar117._0_4_;
    auVar226._4_4_ = fVar174 * auVar117._4_4_;
    auVar226._8_4_ = fVar187 * auVar117._8_4_;
    auVar226._12_4_ = fVar188 * auVar117._12_4_;
    auVar206 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar7,auVar206);
    auVar226 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar6,auVar114);
    auVar206 = vshufps_avx(auVar32,auVar32,0xff);
    auVar114 = vsubps_avx512vl(auVar119,auVar118);
    uVar175 = auVar114._0_4_;
    auVar198._4_4_ = uVar175;
    auVar198._0_4_ = uVar175;
    auVar198._8_4_ = uVar175;
    auVar198._12_4_ = uVar175;
    auVar117 = vshufps_avx(auVar114,auVar114,0x55);
    auVar114 = vshufps_avx(auVar114,auVar114,0xaa);
    auVar115._0_4_ = fVar190 * auVar114._0_4_;
    auVar115._4_4_ = fVar174 * auVar114._4_4_;
    auVar115._8_4_ = fVar187 * auVar114._8_4_;
    auVar115._12_4_ = fVar188 * auVar114._12_4_;
    auVar117 = vfmadd231ps_fma(auVar115,(undefined1  [16])aVar7,auVar117);
    auVar198 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar6,auVar198);
    auVar115 = vshufps_avx512vl(auVar119,auVar119,0xff);
    auVar114 = vsubps_avx512vl(auVar120,auVar118);
    uVar175 = auVar114._0_4_;
    auVar116._4_4_ = uVar175;
    auVar116._0_4_ = uVar175;
    auVar116._8_4_ = uVar175;
    auVar116._12_4_ = uVar175;
    auVar117 = vshufps_avx(auVar114,auVar114,0x55);
    auVar114 = vshufps_avx(auVar114,auVar114,0xaa);
    auVar229._0_4_ = fVar190 * auVar114._0_4_;
    auVar229._4_4_ = fVar174 * auVar114._4_4_;
    auVar229._8_4_ = fVar187 * auVar114._8_4_;
    auVar229._12_4_ = fVar188 * auVar114._12_4_;
    auVar117 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar7,auVar117);
    auVar114 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar6,auVar116);
    auVar116 = vshufps_avx512vl(auVar120,auVar120,0xff);
    auVar38._12_4_ = fStack_894;
    auVar38._0_12_ = *pauVar5;
    auVar117 = vsubps_avx512vl(auVar38,auVar118);
    uVar175 = auVar117._0_4_;
    auVar199._4_4_ = uVar175;
    auVar199._0_4_ = uVar175;
    auVar199._8_4_ = uVar175;
    auVar199._12_4_ = uVar175;
    auVar118 = vshufps_avx(auVar117,auVar117,0x55);
    auVar117 = vshufps_avx(auVar117,auVar117,0xaa);
    auVar233._0_4_ = fVar190 * auVar117._0_4_;
    auVar233._4_4_ = fVar174 * auVar117._4_4_;
    auVar233._8_4_ = fVar187 * auVar117._8_4_;
    auVar233._12_4_ = fVar188 * auVar117._12_4_;
    auVar118 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar7,auVar118);
    auVar117 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar6,auVar199);
    auVar118 = vshufps_avx512vl(auVar38,auVar38,0xff);
    lVar105 = (long)iVar15;
    lVar110 = lVar105 * 0x44;
    auVar126 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar110);
    uVar175 = auVar226._0_4_;
    local_5c0._4_4_ = uVar175;
    local_5c0._0_4_ = uVar175;
    local_5c0._8_4_ = uVar175;
    local_5c0._12_4_ = uVar175;
    local_5c0._16_4_ = uVar175;
    local_5c0._20_4_ = uVar175;
    local_5c0._24_4_ = uVar175;
    local_5c0._28_4_ = uVar175;
    auVar212._8_4_ = 1;
    auVar212._0_8_ = 0x100000001;
    auVar212._12_4_ = 1;
    auVar212._16_4_ = 1;
    auVar212._20_4_ = 1;
    auVar212._24_4_ = 1;
    auVar212._28_4_ = 1;
    local_5e0 = vpermps_avx2(auVar212,ZEXT1632(auVar226));
    local_3c0 = vbroadcastsd_avx512vl(auVar206);
    auVar127 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar110 + 0x484);
    uVar175 = auVar198._0_4_;
    auVar121._4_4_ = uVar175;
    auVar121._0_4_ = uVar175;
    auVar121._8_4_ = uVar175;
    auVar121._12_4_ = uVar175;
    local_600._16_4_ = uVar175;
    local_600._0_16_ = auVar121;
    local_600._20_4_ = uVar175;
    local_600._24_4_ = uVar175;
    local_600._28_4_ = uVar175;
    local_620 = vpermps_avx512vl(auVar212,ZEXT1632(auVar198));
    local_3e0 = vbroadcastsd_avx512vl(auVar115);
    auVar139 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar110 + 0x908);
    uVar175 = auVar114._0_4_;
    local_640._4_4_ = uVar175;
    local_640._0_4_ = uVar175;
    local_640._8_4_ = uVar175;
    local_640._12_4_ = uVar175;
    local_640._16_4_ = uVar175;
    local_640._20_4_ = uVar175;
    local_640._24_4_ = uVar175;
    local_640._28_4_ = uVar175;
    local_660 = vpermps_avx512vl(auVar212,ZEXT1632(auVar114));
    local_400 = vbroadcastsd_avx512vl(auVar116);
    auVar138 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar110 + 0xd8c);
    fVar174 = auVar117._0_4_;
    local_680._4_4_ = fVar174;
    local_680._0_4_ = fVar174;
    fStack_678 = fVar174;
    fStack_674 = fVar174;
    fStack_670 = fVar174;
    fStack_66c = fVar174;
    fStack_668 = fVar174;
    register0x0000139c = fVar174;
    _local_6a0 = vpermps_avx512vl(auVar212,ZEXT1632(auVar117));
    local_420 = vbroadcastsd_avx512vl(auVar118);
    auVar129 = vmulps_avx512vl(_local_680,auVar138);
    auVar130 = vmulps_avx512vl(_local_6a0,auVar138);
    auVar118 = vfmadd231ps_fma(auVar129,auVar139,local_640);
    auVar129 = vfmadd231ps_avx512vl(auVar130,auVar139,local_660);
    auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar127,local_600);
    auVar131 = vfmadd231ps_avx512vl(auVar129,auVar127,local_620);
    auVar132 = vfmadd231ps_avx512vl(ZEXT1632(auVar118),auVar126,local_5c0);
    auVar222 = ZEXT3264(auVar132);
    auVar129 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar110);
    auVar130 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar110 + 0x484);
    auVar137 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar110 + 0x908);
    auVar124 = vfmadd231ps_avx512vl(auVar131,auVar126,local_5e0);
    auVar217 = ZEXT3264(auVar124);
    auVar131 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar110 + 0xd8c);
    auVar125 = vmulps_avx512vl(_local_680,auVar131);
    auVar122 = vmulps_avx512vl(_local_6a0,auVar131);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar137,local_640);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar137,local_660);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar130,local_600);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar130,local_620);
    auVar206 = vfmadd231ps_fma(auVar125,auVar129,local_5c0);
    auVar225 = ZEXT1664(auVar206);
    auVar115 = vfmadd231ps_fma(auVar122,auVar129,local_5e0);
    auVar125 = vsubps_avx512vl(ZEXT1632(auVar206),auVar132);
    auVar122 = vsubps_avx512vl(ZEXT1632(auVar115),auVar124);
    auVar123 = vmulps_avx512vl(auVar124,auVar125);
    auVar133 = vmulps_avx512vl(auVar132,auVar122);
    auVar123 = vsubps_avx512vl(auVar123,auVar133);
    auVar133 = vmulps_avx512vl(local_420,auVar138);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar139,local_400);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar127,local_3e0);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar126,local_3c0);
    auVar134 = vmulps_avx512vl(local_420,auVar131);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar137,local_400);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar130,local_3e0);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar129,local_3c0);
    auVar135 = vmulps_avx512vl(auVar122,auVar122);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar125,auVar125);
    auVar136 = vmaxps_avx512vl(auVar133,auVar134);
    auVar136 = vmulps_avx512vl(auVar136,auVar136);
    auVar135 = vmulps_avx512vl(auVar136,auVar135);
    auVar123 = vmulps_avx512vl(auVar123,auVar123);
    uVar34 = vcmpps_avx512vl(auVar123,auVar135,2);
    auVar118 = vblendps_avx(auVar226,auVar32,8);
    auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar118 = vandps_avx512vl(auVar118,auVar116);
    auVar119 = vblendps_avx(auVar198,auVar119,8);
    auVar119 = vandps_avx512vl(auVar119,auVar116);
    auVar118 = vmaxps_avx(auVar118,auVar119);
    auVar119 = vblendps_avx(auVar114,auVar120,8);
    auVar120 = vandps_avx512vl(auVar119,auVar116);
    auVar119 = vblendps_avx(auVar117,auVar38,8);
    auVar119 = vandps_avx512vl(auVar119,auVar116);
    auVar119 = vmaxps_avx(auVar120,auVar119);
    auVar119 = vmaxps_avx(auVar118,auVar119);
    auVar120 = vmovshdup_avx(auVar119);
    auVar120 = vmaxss_avx(auVar120,auVar119);
    auVar119 = vshufpd_avx(auVar119,auVar119,1);
    auVar119 = vmaxss_avx(auVar119,auVar120);
    auVar231._0_4_ = (float)iVar15;
    local_7a0._4_12_ = auVar226._4_12_;
    local_7a0._0_4_ = auVar231._0_4_;
    local_7a0._16_16_ = auVar128._16_16_;
    auVar231._4_4_ = auVar231._0_4_;
    auVar231._8_4_ = auVar231._0_4_;
    auVar231._12_4_ = auVar231._0_4_;
    auVar231._16_4_ = auVar231._0_4_;
    auVar231._20_4_ = auVar231._0_4_;
    auVar231._24_4_ = auVar231._0_4_;
    auVar231._28_4_ = auVar231._0_4_;
    uVar35 = vcmpps_avx512vl(auVar231,_DAT_01f7b060,0xe);
    bVar112 = (byte)uVar34 & (byte)uVar35;
    fVar190 = auVar119._0_4_ * 4.7683716e-07;
    local_810 = ZEXT416((uint)fVar190);
    auVar207._8_4_ = 2;
    auVar207._0_8_ = 0x200000002;
    auVar207._12_4_ = 2;
    auVar207._16_4_ = 2;
    auVar207._20_4_ = 2;
    auVar207._24_4_ = 2;
    auVar207._28_4_ = 2;
    local_760 = vpermps_avx512vl(auVar207,ZEXT1632(auVar226));
    auVar239 = ZEXT3264(local_760);
    local_780 = vpermps_avx512vl(auVar207,ZEXT1632(auVar198));
    auVar240 = ZEXT3264(local_780);
    auVar128 = vpermps_avx512vl(auVar207,ZEXT1632(auVar114));
    local_480 = vpermps_avx2(auVar207,ZEXT1632(auVar117));
    local_720 = *(undefined4 *)(ray + sVar111 * 4 + 0xc0);
    uStack_71c = 0;
    uStack_718 = 0;
    uStack_714 = 0;
    auVar186 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar186);
    auVar186 = vpbroadcastd_avx512f();
    local_340 = vmovdqa64_avx512f(auVar186);
    if (bVar112 != 0) {
      auVar131 = vmulps_avx512vl(local_480,auVar131);
      auVar137 = vfmadd213ps_avx512vl(auVar137,auVar128,auVar131);
      auVar130 = vfmadd213ps_avx512vl(auVar130,local_780,auVar137);
      auVar130 = vfmadd213ps_avx512vl(auVar129,local_760,auVar130);
      auVar138 = vmulps_avx512vl(local_480,auVar138);
      auVar139 = vfmadd213ps_avx512vl(auVar139,auVar128,auVar138);
      auVar137 = vfmadd213ps_avx512vl(auVar127,local_780,auVar139);
      auVar127 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar110 + 0x1210);
      auVar139 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar110 + 0x1694);
      auVar138 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar110 + 0x1b18);
      auVar129 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar110 + 0x1f9c);
      auVar137 = vfmadd213ps_avx512vl(auVar126,local_760,auVar137);
      auVar227._0_4_ = fVar174 * auVar129._0_4_;
      auVar227._4_4_ = fVar174 * auVar129._4_4_;
      auVar227._8_4_ = fVar174 * auVar129._8_4_;
      auVar227._12_4_ = fVar174 * auVar129._12_4_;
      auVar227._16_4_ = fVar174 * auVar129._16_4_;
      auVar227._20_4_ = fVar174 * auVar129._20_4_;
      auVar227._24_4_ = fVar174 * auVar129._24_4_;
      auVar227._28_4_ = 0;
      auVar126 = vmulps_avx512vl(_local_6a0,auVar129);
      auVar129 = vmulps_avx512vl(local_480,auVar129);
      auVar131 = vfmadd231ps_avx512vl(auVar227,auVar138,local_640);
      auVar126 = vfmadd231ps_avx512vl(auVar126,auVar138,local_660);
      auVar138 = vfmadd231ps_avx512vl(auVar129,auVar128,auVar138);
      auVar129 = vfmadd231ps_avx512vl(auVar131,auVar139,local_600);
      auVar126 = vfmadd231ps_avx512vl(auVar126,auVar139,local_620);
      auVar131 = vfmadd231ps_avx512vl(auVar138,local_780,auVar139);
      auVar119 = vfmadd231ps_fma(auVar129,auVar127,local_5c0);
      auVar129 = vfmadd231ps_avx512vl(auVar126,auVar127,local_5e0);
      auVar126 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar110 + 0x1210);
      auVar139 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar110 + 0x1b18);
      auVar138 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar110 + 0x1f9c);
      auVar131 = vfmadd231ps_avx512vl(auVar131,local_760,auVar127);
      auVar48._4_4_ = fVar174 * auVar138._4_4_;
      auVar48._0_4_ = fVar174 * auVar138._0_4_;
      auVar48._8_4_ = fVar174 * auVar138._8_4_;
      auVar48._12_4_ = fVar174 * auVar138._12_4_;
      auVar48._16_4_ = fVar174 * auVar138._16_4_;
      auVar48._20_4_ = fVar174 * auVar138._20_4_;
      auVar48._24_4_ = fVar174 * auVar138._24_4_;
      auVar48._28_4_ = auVar127._28_4_;
      auVar127 = vmulps_avx512vl(_local_6a0,auVar138);
      auVar138 = vmulps_avx512vl(local_480,auVar138);
      auVar123 = vfmadd231ps_avx512vl(auVar48,auVar139,local_640);
      auVar135 = vfmadd231ps_avx512vl(auVar127,auVar139,local_660);
      auVar239 = ZEXT3264(local_760);
      auVar240 = ZEXT3264(local_780);
      auVar186 = ZEXT3264(auVar128);
      auVar139 = vfmadd231ps_avx512vl(auVar138,auVar128,auVar139);
      auVar127 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar110 + 0x1694);
      auVar138 = vfmadd231ps_avx512vl(auVar123,auVar127,local_600);
      auVar123 = vfmadd231ps_avx512vl(auVar135,auVar127,local_620);
      auVar127 = vfmadd231ps_avx512vl(auVar139,local_780,auVar127);
      auVar120 = vfmadd231ps_fma(auVar138,auVar126,local_5c0);
      auVar139 = vfmadd231ps_avx512vl(auVar123,auVar126,local_5e0);
      auVar138 = vfmadd231ps_avx512vl(auVar127,local_760,auVar126);
      auVar237._8_4_ = 0x7fffffff;
      auVar237._0_8_ = 0x7fffffff7fffffff;
      auVar237._12_4_ = 0x7fffffff;
      auVar237._16_4_ = 0x7fffffff;
      auVar237._20_4_ = 0x7fffffff;
      auVar237._24_4_ = 0x7fffffff;
      auVar237._28_4_ = 0x7fffffff;
      auVar126 = vandps_avx(ZEXT1632(auVar119),auVar237);
      auVar127 = vandps_avx(auVar129,auVar237);
      auVar127 = vmaxps_avx(auVar126,auVar127);
      auVar126 = vandps_avx(auVar131,auVar237);
      auVar126 = vmaxps_avx(auVar127,auVar126);
      auVar232._4_4_ = fVar190;
      auVar232._0_4_ = fVar190;
      auVar232._8_4_ = fVar190;
      auVar232._12_4_ = fVar190;
      auVar232._16_4_ = fVar190;
      auVar232._20_4_ = fVar190;
      auVar232._24_4_ = fVar190;
      auVar232._28_4_ = fVar190;
      uVar102 = vcmpps_avx512vl(auVar126,auVar232,1);
      bVar18 = (bool)((byte)uVar102 & 1);
      auVar140._0_4_ = (float)((uint)bVar18 * auVar125._0_4_ | (uint)!bVar18 * auVar119._0_4_);
      bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar140._4_4_ = (float)((uint)bVar18 * auVar125._4_4_ | (uint)!bVar18 * auVar119._4_4_);
      bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar140._8_4_ = (float)((uint)bVar18 * auVar125._8_4_ | (uint)!bVar18 * auVar119._8_4_);
      bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar140._12_4_ = (float)((uint)bVar18 * auVar125._12_4_ | (uint)!bVar18 * auVar119._12_4_);
      fVar174 = (float)((uint)((byte)(uVar102 >> 4) & 1) * auVar125._16_4_);
      auVar140._16_4_ = fVar174;
      fVar187 = (float)((uint)((byte)(uVar102 >> 5) & 1) * auVar125._20_4_);
      auVar140._20_4_ = fVar187;
      fVar188 = (float)((uint)((byte)(uVar102 >> 6) & 1) * auVar125._24_4_);
      auVar140._24_4_ = fVar188;
      uVar103 = (uint)(byte)(uVar102 >> 7) * auVar125._28_4_;
      auVar140._28_4_ = uVar103;
      bVar18 = (bool)((byte)uVar102 & 1);
      auVar141._0_4_ = (float)((uint)bVar18 * auVar122._0_4_ | (uint)!bVar18 * auVar129._0_4_);
      bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar141._4_4_ = (float)((uint)bVar18 * auVar122._4_4_ | (uint)!bVar18 * auVar129._4_4_);
      bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar141._8_4_ = (float)((uint)bVar18 * auVar122._8_4_ | (uint)!bVar18 * auVar129._8_4_);
      bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar141._12_4_ = (float)((uint)bVar18 * auVar122._12_4_ | (uint)!bVar18 * auVar129._12_4_);
      bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
      auVar141._16_4_ = (float)((uint)bVar18 * auVar122._16_4_ | (uint)!bVar18 * auVar129._16_4_);
      bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
      auVar141._20_4_ = (float)((uint)bVar18 * auVar122._20_4_ | (uint)!bVar18 * auVar129._20_4_);
      bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
      auVar141._24_4_ = (float)((uint)bVar18 * auVar122._24_4_ | (uint)!bVar18 * auVar129._24_4_);
      bVar18 = SUB81(uVar102 >> 7,0);
      auVar141._28_4_ = (uint)bVar18 * auVar122._28_4_ | (uint)!bVar18 * auVar129._28_4_;
      auVar126 = vandps_avx(auVar237,ZEXT1632(auVar120));
      auVar127 = vandps_avx(auVar139,auVar237);
      auVar127 = vmaxps_avx(auVar126,auVar127);
      auVar126 = vandps_avx(auVar138,auVar237);
      auVar126 = vmaxps_avx(auVar127,auVar126);
      uVar102 = vcmpps_avx512vl(auVar126,auVar232,1);
      bVar18 = (bool)((byte)uVar102 & 1);
      auVar142._0_4_ = (float)((uint)bVar18 * auVar125._0_4_ | (uint)!bVar18 * auVar120._0_4_);
      bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar142._4_4_ = (float)((uint)bVar18 * auVar125._4_4_ | (uint)!bVar18 * auVar120._4_4_);
      bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar142._8_4_ = (float)((uint)bVar18 * auVar125._8_4_ | (uint)!bVar18 * auVar120._8_4_);
      bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar142._12_4_ = (float)((uint)bVar18 * auVar125._12_4_ | (uint)!bVar18 * auVar120._12_4_);
      fVar197 = (float)((uint)((byte)(uVar102 >> 4) & 1) * auVar125._16_4_);
      auVar142._16_4_ = fVar197;
      fVar196 = (float)((uint)((byte)(uVar102 >> 5) & 1) * auVar125._20_4_);
      auVar142._20_4_ = fVar196;
      fVar211 = (float)((uint)((byte)(uVar102 >> 6) & 1) * auVar125._24_4_);
      auVar142._24_4_ = fVar211;
      auVar142._28_4_ = (uint)(byte)(uVar102 >> 7) * auVar125._28_4_;
      bVar18 = (bool)((byte)uVar102 & 1);
      auVar143._0_4_ = (float)((uint)bVar18 * auVar122._0_4_ | (uint)!bVar18 * auVar139._0_4_);
      bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar143._4_4_ = (float)((uint)bVar18 * auVar122._4_4_ | (uint)!bVar18 * auVar139._4_4_);
      bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar143._8_4_ = (float)((uint)bVar18 * auVar122._8_4_ | (uint)!bVar18 * auVar139._8_4_);
      bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar143._12_4_ = (float)((uint)bVar18 * auVar122._12_4_ | (uint)!bVar18 * auVar139._12_4_);
      bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
      auVar143._16_4_ = (float)((uint)bVar18 * auVar122._16_4_ | (uint)!bVar18 * auVar139._16_4_);
      bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
      auVar143._20_4_ = (float)((uint)bVar18 * auVar122._20_4_ | (uint)!bVar18 * auVar139._20_4_);
      bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
      auVar143._24_4_ = (float)((uint)bVar18 * auVar122._24_4_ | (uint)!bVar18 * auVar139._24_4_);
      bVar18 = SUB81(uVar102 >> 7,0);
      auVar143._28_4_ = (uint)bVar18 * auVar122._28_4_ | (uint)!bVar18 * auVar139._28_4_;
      auVar121 = vxorps_avx512vl(auVar121,auVar121);
      auVar126 = vfmadd213ps_avx512vl(auVar140,auVar140,ZEXT1632(auVar121));
      auVar119 = vfmadd231ps_fma(auVar126,auVar141,auVar141);
      auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar119));
      fVar113 = auVar126._0_4_;
      fVar195 = auVar126._4_4_;
      fVar166 = auVar126._8_4_;
      fVar167 = auVar126._12_4_;
      fVar168 = auVar126._16_4_;
      fVar169 = auVar126._20_4_;
      fVar170 = auVar126._24_4_;
      auVar49._4_4_ = fVar195 * fVar195 * fVar195 * auVar119._4_4_ * -0.5;
      auVar49._0_4_ = fVar113 * fVar113 * fVar113 * auVar119._0_4_ * -0.5;
      auVar49._8_4_ = fVar166 * fVar166 * fVar166 * auVar119._8_4_ * -0.5;
      auVar49._12_4_ = fVar167 * fVar167 * fVar167 * auVar119._12_4_ * -0.5;
      auVar49._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
      auVar49._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
      auVar49._24_4_ = fVar170 * fVar170 * fVar170 * -0.0;
      auVar49._28_4_ = 0;
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar139 = vfmadd231ps_avx512vl(auVar49,auVar127,auVar126);
      auVar50._4_4_ = auVar141._4_4_ * auVar139._4_4_;
      auVar50._0_4_ = auVar141._0_4_ * auVar139._0_4_;
      auVar50._8_4_ = auVar141._8_4_ * auVar139._8_4_;
      auVar50._12_4_ = auVar141._12_4_ * auVar139._12_4_;
      auVar50._16_4_ = auVar141._16_4_ * auVar139._16_4_;
      auVar50._20_4_ = auVar141._20_4_ * auVar139._20_4_;
      auVar50._24_4_ = auVar141._24_4_ * auVar139._24_4_;
      auVar50._28_4_ = auVar126._28_4_;
      auVar51._4_4_ = auVar139._4_4_ * -auVar140._4_4_;
      auVar51._0_4_ = auVar139._0_4_ * -auVar140._0_4_;
      auVar51._8_4_ = auVar139._8_4_ * -auVar140._8_4_;
      auVar51._12_4_ = auVar139._12_4_ * -auVar140._12_4_;
      auVar51._16_4_ = auVar139._16_4_ * -fVar174;
      auVar51._20_4_ = auVar139._20_4_ * -fVar187;
      auVar51._24_4_ = auVar139._24_4_ * -fVar188;
      auVar51._28_4_ = uVar103 ^ 0x80000000;
      auVar126 = vmulps_avx512vl(auVar139,ZEXT1632(auVar121));
      auVar131 = ZEXT1632(auVar121);
      auVar138 = vfmadd213ps_avx512vl(auVar142,auVar142,auVar131);
      auVar119 = vfmadd231ps_fma(auVar138,auVar143,auVar143);
      auVar138 = vrsqrt14ps_avx512vl(ZEXT1632(auVar119));
      fVar174 = auVar138._0_4_;
      fVar187 = auVar138._4_4_;
      fVar188 = auVar138._8_4_;
      fVar113 = auVar138._12_4_;
      fVar195 = auVar138._16_4_;
      fVar166 = auVar138._20_4_;
      fVar167 = auVar138._24_4_;
      auVar52._4_4_ = fVar187 * fVar187 * fVar187 * auVar119._4_4_ * -0.5;
      auVar52._0_4_ = fVar174 * fVar174 * fVar174 * auVar119._0_4_ * -0.5;
      auVar52._8_4_ = fVar188 * fVar188 * fVar188 * auVar119._8_4_ * -0.5;
      auVar52._12_4_ = fVar113 * fVar113 * fVar113 * auVar119._12_4_ * -0.5;
      auVar52._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
      auVar52._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
      auVar52._24_4_ = fVar167 * fVar167 * fVar167 * -0.0;
      auVar52._28_4_ = 0;
      auVar127 = vfmadd231ps_avx512vl(auVar52,auVar127,auVar138);
      auVar53._4_4_ = auVar143._4_4_ * auVar127._4_4_;
      auVar53._0_4_ = auVar143._0_4_ * auVar127._0_4_;
      auVar53._8_4_ = auVar143._8_4_ * auVar127._8_4_;
      auVar53._12_4_ = auVar143._12_4_ * auVar127._12_4_;
      auVar53._16_4_ = auVar143._16_4_ * auVar127._16_4_;
      auVar53._20_4_ = auVar143._20_4_ * auVar127._20_4_;
      auVar53._24_4_ = auVar143._24_4_ * auVar127._24_4_;
      auVar53._28_4_ = auVar138._28_4_;
      auVar54._4_4_ = -auVar142._4_4_ * auVar127._4_4_;
      auVar54._0_4_ = -auVar142._0_4_ * auVar127._0_4_;
      auVar54._8_4_ = -auVar142._8_4_ * auVar127._8_4_;
      auVar54._12_4_ = -auVar142._12_4_ * auVar127._12_4_;
      auVar54._16_4_ = -fVar197 * auVar127._16_4_;
      auVar54._20_4_ = -fVar196 * auVar127._20_4_;
      auVar54._24_4_ = -fVar211 * auVar127._24_4_;
      auVar54._28_4_ = auVar139._28_4_;
      auVar127 = vmulps_avx512vl(auVar127,auVar131);
      auVar119 = vfmadd213ps_fma(auVar50,auVar133,auVar132);
      auVar120 = vfmadd213ps_fma(auVar51,auVar133,auVar124);
      auVar139 = vfmadd213ps_avx512vl(auVar126,auVar133,auVar137);
      auVar138 = vfmadd213ps_avx512vl(auVar53,auVar134,ZEXT1632(auVar206));
      auVar226 = vfnmadd213ps_fma(auVar50,auVar133,auVar132);
      auVar118 = vfmadd213ps_fma(auVar54,auVar134,ZEXT1632(auVar115));
      auVar198 = vfnmadd213ps_fma(auVar51,auVar133,auVar124);
      auVar117 = vfmadd213ps_fma(auVar127,auVar134,auVar130);
      auVar129 = vfnmadd231ps_avx512vl(auVar137,auVar133,auVar126);
      auVar38 = vfnmadd213ps_fma(auVar53,auVar134,ZEXT1632(auVar206));
      auVar115 = vfnmadd213ps_fma(auVar54,auVar134,ZEXT1632(auVar115));
      auVar116 = vfnmadd231ps_fma(auVar130,auVar134,auVar127);
      auVar127 = vsubps_avx512vl(auVar138,ZEXT1632(auVar226));
      auVar126 = vsubps_avx(ZEXT1632(auVar118),ZEXT1632(auVar198));
      auVar130 = vsubps_avx512vl(ZEXT1632(auVar117),auVar129);
      auVar137 = vmulps_avx512vl(auVar126,auVar129);
      auVar206 = vfmsub231ps_fma(auVar137,ZEXT1632(auVar198),auVar130);
      auVar55._4_4_ = auVar226._4_4_ * auVar130._4_4_;
      auVar55._0_4_ = auVar226._0_4_ * auVar130._0_4_;
      auVar55._8_4_ = auVar226._8_4_ * auVar130._8_4_;
      auVar55._12_4_ = auVar226._12_4_ * auVar130._12_4_;
      auVar55._16_4_ = auVar130._16_4_ * 0.0;
      auVar55._20_4_ = auVar130._20_4_ * 0.0;
      auVar55._24_4_ = auVar130._24_4_ * 0.0;
      auVar55._28_4_ = auVar130._28_4_;
      auVar130 = vfmsub231ps_avx512vl(auVar55,auVar129,auVar127);
      auVar56._4_4_ = auVar198._4_4_ * auVar127._4_4_;
      auVar56._0_4_ = auVar198._0_4_ * auVar127._0_4_;
      auVar56._8_4_ = auVar198._8_4_ * auVar127._8_4_;
      auVar56._12_4_ = auVar198._12_4_ * auVar127._12_4_;
      auVar56._16_4_ = auVar127._16_4_ * 0.0;
      auVar56._20_4_ = auVar127._20_4_ * 0.0;
      auVar56._24_4_ = auVar127._24_4_ * 0.0;
      auVar56._28_4_ = auVar127._28_4_;
      auVar114 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar226),auVar126);
      auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),auVar131,auVar130);
      auVar126 = vfmadd231ps_avx512vl(auVar126,auVar131,ZEXT1632(auVar206));
      auVar122 = ZEXT1632(auVar121);
      uVar102 = vcmpps_avx512vl(auVar126,auVar122,2);
      bVar101 = (byte)uVar102;
      fVar113 = (float)((uint)(bVar101 & 1) * auVar119._0_4_ |
                       (uint)!(bool)(bVar101 & 1) * auVar38._0_4_);
      bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
      fVar166 = (float)((uint)bVar18 * auVar119._4_4_ | (uint)!bVar18 * auVar38._4_4_);
      bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
      fVar168 = (float)((uint)bVar18 * auVar119._8_4_ | (uint)!bVar18 * auVar38._8_4_);
      bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
      fVar170 = (float)((uint)bVar18 * auVar119._12_4_ | (uint)!bVar18 * auVar38._12_4_);
      auVar137 = ZEXT1632(CONCAT412(fVar170,CONCAT48(fVar168,CONCAT44(fVar166,fVar113))));
      fVar195 = (float)((uint)(bVar101 & 1) * auVar120._0_4_ |
                       (uint)!(bool)(bVar101 & 1) * auVar115._0_4_);
      bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
      fVar167 = (float)((uint)bVar18 * auVar120._4_4_ | (uint)!bVar18 * auVar115._4_4_);
      bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
      fVar169 = (float)((uint)bVar18 * auVar120._8_4_ | (uint)!bVar18 * auVar115._8_4_);
      bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
      fVar171 = (float)((uint)bVar18 * auVar120._12_4_ | (uint)!bVar18 * auVar115._12_4_);
      auVar131 = ZEXT1632(CONCAT412(fVar171,CONCAT48(fVar169,CONCAT44(fVar167,fVar195))));
      auVar144._0_4_ =
           (float)((uint)(bVar101 & 1) * auVar139._0_4_ |
                  (uint)!(bool)(bVar101 & 1) * auVar116._0_4_);
      bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar144._4_4_ = (float)((uint)bVar18 * auVar139._4_4_ | (uint)!bVar18 * auVar116._4_4_);
      bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar144._8_4_ = (float)((uint)bVar18 * auVar139._8_4_ | (uint)!bVar18 * auVar116._8_4_);
      bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar144._12_4_ = (float)((uint)bVar18 * auVar139._12_4_ | (uint)!bVar18 * auVar116._12_4_);
      fVar174 = (float)((uint)((byte)(uVar102 >> 4) & 1) * auVar139._16_4_);
      auVar144._16_4_ = fVar174;
      fVar187 = (float)((uint)((byte)(uVar102 >> 5) & 1) * auVar139._20_4_);
      auVar144._20_4_ = fVar187;
      fVar188 = (float)((uint)((byte)(uVar102 >> 6) & 1) * auVar139._24_4_);
      auVar144._24_4_ = fVar188;
      iVar1 = (uint)(byte)(uVar102 >> 7) * auVar139._28_4_;
      auVar144._28_4_ = iVar1;
      auVar127 = vblendmps_avx512vl(ZEXT1632(auVar226),auVar138);
      auVar145._0_4_ =
           (uint)(bVar101 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar101 & 1) * auVar120._0_4_;
      bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar145._4_4_ = (uint)bVar18 * auVar127._4_4_ | (uint)!bVar18 * auVar120._4_4_;
      bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar145._8_4_ = (uint)bVar18 * auVar127._8_4_ | (uint)!bVar18 * auVar120._8_4_;
      bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar145._12_4_ = (uint)bVar18 * auVar127._12_4_ | (uint)!bVar18 * auVar120._12_4_;
      auVar145._16_4_ = (uint)((byte)(uVar102 >> 4) & 1) * auVar127._16_4_;
      auVar145._20_4_ = (uint)((byte)(uVar102 >> 5) & 1) * auVar127._20_4_;
      auVar145._24_4_ = (uint)((byte)(uVar102 >> 6) & 1) * auVar127._24_4_;
      auVar145._28_4_ = (uint)(byte)(uVar102 >> 7) * auVar127._28_4_;
      auVar127 = vblendmps_avx512vl(ZEXT1632(auVar198),ZEXT1632(auVar118));
      auVar146._0_4_ =
           (float)((uint)(bVar101 & 1) * auVar127._0_4_ |
                  (uint)!(bool)(bVar101 & 1) * auVar206._0_4_);
      bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar146._4_4_ = (float)((uint)bVar18 * auVar127._4_4_ | (uint)!bVar18 * auVar206._4_4_);
      bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar146._8_4_ = (float)((uint)bVar18 * auVar127._8_4_ | (uint)!bVar18 * auVar206._8_4_);
      bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar146._12_4_ = (float)((uint)bVar18 * auVar127._12_4_ | (uint)!bVar18 * auVar206._12_4_);
      fVar211 = (float)((uint)((byte)(uVar102 >> 4) & 1) * auVar127._16_4_);
      auVar146._16_4_ = fVar211;
      fVar196 = (float)((uint)((byte)(uVar102 >> 5) & 1) * auVar127._20_4_);
      auVar146._20_4_ = fVar196;
      fVar197 = (float)((uint)((byte)(uVar102 >> 6) & 1) * auVar127._24_4_);
      auVar146._24_4_ = fVar197;
      auVar146._28_4_ = (uint)(byte)(uVar102 >> 7) * auVar127._28_4_;
      auVar127 = vblendmps_avx512vl(auVar129,ZEXT1632(auVar117));
      auVar147._0_4_ =
           (float)((uint)(bVar101 & 1) * auVar127._0_4_ |
                  (uint)!(bool)(bVar101 & 1) * auVar139._0_4_);
      bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar147._4_4_ = (float)((uint)bVar18 * auVar127._4_4_ | (uint)!bVar18 * auVar139._4_4_);
      bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar147._8_4_ = (float)((uint)bVar18 * auVar127._8_4_ | (uint)!bVar18 * auVar139._8_4_);
      bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar147._12_4_ = (float)((uint)bVar18 * auVar127._12_4_ | (uint)!bVar18 * auVar139._12_4_);
      bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
      auVar147._16_4_ = (float)((uint)bVar18 * auVar127._16_4_ | (uint)!bVar18 * auVar139._16_4_);
      bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
      auVar147._20_4_ = (float)((uint)bVar18 * auVar127._20_4_ | (uint)!bVar18 * auVar139._20_4_);
      bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
      auVar147._24_4_ = (float)((uint)bVar18 * auVar127._24_4_ | (uint)!bVar18 * auVar139._24_4_);
      bVar18 = SUB81(uVar102 >> 7,0);
      auVar147._28_4_ = (uint)bVar18 * auVar127._28_4_ | (uint)!bVar18 * auVar139._28_4_;
      auVar148._0_4_ =
           (uint)(bVar101 & 1) * (int)auVar226._0_4_ | (uint)!(bool)(bVar101 & 1) * auVar138._0_4_;
      bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar148._4_4_ = (uint)bVar18 * (int)auVar226._4_4_ | (uint)!bVar18 * auVar138._4_4_;
      bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar148._8_4_ = (uint)bVar18 * (int)auVar226._8_4_ | (uint)!bVar18 * auVar138._8_4_;
      bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar148._12_4_ = (uint)bVar18 * (int)auVar226._12_4_ | (uint)!bVar18 * auVar138._12_4_;
      auVar148._16_4_ = (uint)!(bool)((byte)(uVar102 >> 4) & 1) * auVar138._16_4_;
      auVar148._20_4_ = (uint)!(bool)((byte)(uVar102 >> 5) & 1) * auVar138._20_4_;
      auVar148._24_4_ = (uint)!(bool)((byte)(uVar102 >> 6) & 1) * auVar138._24_4_;
      auVar148._28_4_ = (uint)!SUB81(uVar102 >> 7,0) * auVar138._28_4_;
      bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
      bVar20 = (bool)((byte)(uVar102 >> 2) & 1);
      bVar21 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar149._0_4_ =
           (uint)(bVar101 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar101 & 1) * auVar117._0_4_;
      bVar19 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar149._4_4_ = (uint)bVar19 * auVar129._4_4_ | (uint)!bVar19 * auVar117._4_4_;
      bVar19 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar149._8_4_ = (uint)bVar19 * auVar129._8_4_ | (uint)!bVar19 * auVar117._8_4_;
      bVar19 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar149._12_4_ = (uint)bVar19 * auVar129._12_4_ | (uint)!bVar19 * auVar117._12_4_;
      auVar149._16_4_ = (uint)((byte)(uVar102 >> 4) & 1) * auVar129._16_4_;
      auVar149._20_4_ = (uint)((byte)(uVar102 >> 5) & 1) * auVar129._20_4_;
      auVar149._24_4_ = (uint)((byte)(uVar102 >> 6) & 1) * auVar129._24_4_;
      iVar2 = (uint)(byte)(uVar102 >> 7) * auVar129._28_4_;
      auVar149._28_4_ = iVar2;
      auVar132 = vsubps_avx512vl(auVar148,auVar137);
      auVar127 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar198._12_4_ |
                                               (uint)!bVar21 * auVar118._12_4_,
                                               CONCAT48((uint)bVar20 * (int)auVar198._8_4_ |
                                                        (uint)!bVar20 * auVar118._8_4_,
                                                        CONCAT44((uint)bVar18 * (int)auVar198._4_4_
                                                                 | (uint)!bVar18 * auVar118._4_4_,
                                                                 (uint)(bVar101 & 1) *
                                                                 (int)auVar198._0_4_ |
                                                                 (uint)!(bool)(bVar101 & 1) *
                                                                 auVar118._0_4_)))),auVar131);
      auVar222 = ZEXT3264(auVar127);
      auVar139 = vsubps_avx(auVar149,auVar144);
      auVar138 = vsubps_avx(auVar137,auVar145);
      auVar225 = ZEXT3264(auVar138);
      auVar129 = vsubps_avx(auVar131,auVar146);
      auVar130 = vsubps_avx(auVar144,auVar147);
      auVar57._4_4_ = auVar139._4_4_ * fVar166;
      auVar57._0_4_ = auVar139._0_4_ * fVar113;
      auVar57._8_4_ = auVar139._8_4_ * fVar168;
      auVar57._12_4_ = auVar139._12_4_ * fVar170;
      auVar57._16_4_ = auVar139._16_4_ * 0.0;
      auVar57._20_4_ = auVar139._20_4_ * 0.0;
      auVar57._24_4_ = auVar139._24_4_ * 0.0;
      auVar57._28_4_ = iVar2;
      auVar119 = vfmsub231ps_fma(auVar57,auVar144,auVar132);
      auVar58._4_4_ = fVar167 * auVar132._4_4_;
      auVar58._0_4_ = fVar195 * auVar132._0_4_;
      auVar58._8_4_ = fVar169 * auVar132._8_4_;
      auVar58._12_4_ = fVar171 * auVar132._12_4_;
      auVar58._16_4_ = auVar132._16_4_ * 0.0;
      auVar58._20_4_ = auVar132._20_4_ * 0.0;
      auVar58._24_4_ = auVar132._24_4_ * 0.0;
      auVar58._28_4_ = auVar126._28_4_;
      auVar120 = vfmsub231ps_fma(auVar58,auVar137,auVar127);
      auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar120),auVar122,ZEXT1632(auVar119));
      auVar213._0_4_ = auVar127._0_4_ * auVar144._0_4_;
      auVar213._4_4_ = auVar127._4_4_ * auVar144._4_4_;
      auVar213._8_4_ = auVar127._8_4_ * auVar144._8_4_;
      auVar213._12_4_ = auVar127._12_4_ * auVar144._12_4_;
      auVar213._16_4_ = auVar127._16_4_ * fVar174;
      auVar213._20_4_ = auVar127._20_4_ * fVar187;
      auVar213._24_4_ = auVar127._24_4_ * fVar188;
      auVar213._28_4_ = 0;
      auVar119 = vfmsub231ps_fma(auVar213,auVar131,auVar139);
      auVar124 = vfmadd231ps_avx512vl(auVar126,auVar122,ZEXT1632(auVar119));
      auVar126 = vmulps_avx512vl(auVar130,auVar145);
      auVar126 = vfmsub231ps_avx512vl(auVar126,auVar138,auVar147);
      auVar59._4_4_ = auVar129._4_4_ * auVar147._4_4_;
      auVar59._0_4_ = auVar129._0_4_ * auVar147._0_4_;
      auVar59._8_4_ = auVar129._8_4_ * auVar147._8_4_;
      auVar59._12_4_ = auVar129._12_4_ * auVar147._12_4_;
      auVar59._16_4_ = auVar129._16_4_ * auVar147._16_4_;
      auVar59._20_4_ = auVar129._20_4_ * auVar147._20_4_;
      auVar59._24_4_ = auVar129._24_4_ * auVar147._24_4_;
      auVar59._28_4_ = auVar147._28_4_;
      auVar119 = vfmsub231ps_fma(auVar59,auVar146,auVar130);
      auVar214._0_4_ = auVar146._0_4_ * auVar138._0_4_;
      auVar214._4_4_ = auVar146._4_4_ * auVar138._4_4_;
      auVar214._8_4_ = auVar146._8_4_ * auVar138._8_4_;
      auVar214._12_4_ = auVar146._12_4_ * auVar138._12_4_;
      auVar214._16_4_ = fVar211 * auVar138._16_4_;
      auVar214._20_4_ = fVar196 * auVar138._20_4_;
      auVar214._24_4_ = fVar197 * auVar138._24_4_;
      auVar214._28_4_ = 0;
      auVar120 = vfmsub231ps_fma(auVar214,auVar129,auVar145);
      auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar120),auVar122,auVar126);
      auVar125 = vfmadd231ps_avx512vl(auVar126,auVar122,ZEXT1632(auVar119));
      auVar217 = ZEXT3264(auVar125);
      auVar126 = vmaxps_avx(auVar124,auVar125);
      uVar34 = vcmpps_avx512vl(auVar126,auVar122,2);
      bVar112 = bVar112 & (byte)uVar34;
      if (bVar112 != 0) {
        auVar60._4_4_ = auVar130._4_4_ * auVar127._4_4_;
        auVar60._0_4_ = auVar130._0_4_ * auVar127._0_4_;
        auVar60._8_4_ = auVar130._8_4_ * auVar127._8_4_;
        auVar60._12_4_ = auVar130._12_4_ * auVar127._12_4_;
        auVar60._16_4_ = auVar130._16_4_ * auVar127._16_4_;
        auVar60._20_4_ = auVar130._20_4_ * auVar127._20_4_;
        auVar60._24_4_ = auVar130._24_4_ * auVar127._24_4_;
        auVar60._28_4_ = auVar126._28_4_;
        auVar206 = vfmsub231ps_fma(auVar60,auVar129,auVar139);
        auVar61._4_4_ = auVar139._4_4_ * auVar138._4_4_;
        auVar61._0_4_ = auVar139._0_4_ * auVar138._0_4_;
        auVar61._8_4_ = auVar139._8_4_ * auVar138._8_4_;
        auVar61._12_4_ = auVar139._12_4_ * auVar138._12_4_;
        auVar61._16_4_ = auVar139._16_4_ * auVar138._16_4_;
        auVar61._20_4_ = auVar139._20_4_ * auVar138._20_4_;
        auVar61._24_4_ = auVar139._24_4_ * auVar138._24_4_;
        auVar61._28_4_ = auVar139._28_4_;
        auVar118 = vfmsub231ps_fma(auVar61,auVar132,auVar130);
        auVar62._4_4_ = auVar129._4_4_ * auVar132._4_4_;
        auVar62._0_4_ = auVar129._0_4_ * auVar132._0_4_;
        auVar62._8_4_ = auVar129._8_4_ * auVar132._8_4_;
        auVar62._12_4_ = auVar129._12_4_ * auVar132._12_4_;
        auVar62._16_4_ = auVar129._16_4_ * auVar132._16_4_;
        auVar62._20_4_ = auVar129._20_4_ * auVar132._20_4_;
        auVar62._24_4_ = auVar129._24_4_ * auVar132._24_4_;
        auVar62._28_4_ = auVar129._28_4_;
        auVar117 = vfmsub231ps_fma(auVar62,auVar138,auVar127);
        auVar119 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar118),ZEXT1632(auVar117));
        auVar120 = vfmadd231ps_fma(ZEXT1632(auVar119),ZEXT1632(auVar206),
                                   ZEXT1232(ZEXT412(0)) << 0x20);
        auVar126 = vrcp14ps_avx512vl(ZEXT1632(auVar120));
        auVar225 = ZEXT3264(auVar126);
        auVar39._8_4_ = 0x3f800000;
        auVar39._0_8_ = 0x3f8000003f800000;
        auVar39._12_4_ = 0x3f800000;
        auVar39._16_4_ = 0x3f800000;
        auVar39._20_4_ = 0x3f800000;
        auVar39._24_4_ = 0x3f800000;
        auVar39._28_4_ = 0x3f800000;
        auVar127 = vfnmadd213ps_avx512vl(auVar126,ZEXT1632(auVar120),auVar39);
        auVar119 = vfmadd132ps_fma(auVar127,auVar126,auVar126);
        auVar222 = ZEXT1664(auVar119);
        auVar63._4_4_ = auVar117._4_4_ * auVar144._4_4_;
        auVar63._0_4_ = auVar117._0_4_ * auVar144._0_4_;
        auVar63._8_4_ = auVar117._8_4_ * auVar144._8_4_;
        auVar63._12_4_ = auVar117._12_4_ * auVar144._12_4_;
        auVar63._16_4_ = fVar174 * 0.0;
        auVar63._20_4_ = fVar187 * 0.0;
        auVar63._24_4_ = fVar188 * 0.0;
        auVar63._28_4_ = iVar1;
        auVar118 = vfmadd231ps_fma(auVar63,auVar131,ZEXT1632(auVar118));
        auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar137,ZEXT1632(auVar206));
        fVar174 = auVar119._0_4_;
        fVar187 = auVar119._4_4_;
        fVar188 = auVar119._8_4_;
        fVar197 = auVar119._12_4_;
        local_560 = ZEXT1632(CONCAT412(auVar118._12_4_ * fVar197,
                                       CONCAT48(auVar118._8_4_ * fVar188,
                                                CONCAT44(auVar118._4_4_ * fVar187,
                                                         auVar118._0_4_ * fVar174))));
        auVar230 = ZEXT3264(local_560);
        auVar178._4_4_ = local_720;
        auVar178._0_4_ = local_720;
        auVar178._8_4_ = local_720;
        auVar178._12_4_ = local_720;
        auVar178._16_4_ = local_720;
        auVar178._20_4_ = local_720;
        auVar178._24_4_ = local_720;
        auVar178._28_4_ = local_720;
        uVar34 = vcmpps_avx512vl(auVar178,local_560,2);
        uVar175 = *(undefined4 *)(ray + sVar111 * 4 + 0x200);
        auVar40._4_4_ = uVar175;
        auVar40._0_4_ = uVar175;
        auVar40._8_4_ = uVar175;
        auVar40._12_4_ = uVar175;
        auVar40._16_4_ = uVar175;
        auVar40._20_4_ = uVar175;
        auVar40._24_4_ = uVar175;
        auVar40._28_4_ = uVar175;
        uVar35 = vcmpps_avx512vl(local_560,auVar40,2);
        bVar112 = (byte)uVar34 & (byte)uVar35 & bVar112;
        if (bVar112 != 0) {
          uVar109 = vcmpps_avx512vl(ZEXT1632(auVar120),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar109 = bVar112 & uVar109;
          if ((char)uVar109 != '\0') {
            fVar196 = auVar124._0_4_ * fVar174;
            fVar211 = auVar124._4_4_ * fVar187;
            auVar64._4_4_ = fVar211;
            auVar64._0_4_ = fVar196;
            fVar113 = auVar124._8_4_ * fVar188;
            auVar64._8_4_ = fVar113;
            fVar195 = auVar124._12_4_ * fVar197;
            auVar64._12_4_ = fVar195;
            fVar166 = auVar124._16_4_ * 0.0;
            auVar64._16_4_ = fVar166;
            fVar167 = auVar124._20_4_ * 0.0;
            auVar64._20_4_ = fVar167;
            fVar168 = auVar124._24_4_ * 0.0;
            auVar64._24_4_ = fVar168;
            auVar64._28_4_ = auVar124._28_4_;
            auVar179._8_4_ = 0x3f800000;
            auVar179._0_8_ = 0x3f8000003f800000;
            auVar179._12_4_ = 0x3f800000;
            auVar179._16_4_ = 0x3f800000;
            auVar179._20_4_ = 0x3f800000;
            auVar179._24_4_ = 0x3f800000;
            auVar179._28_4_ = 0x3f800000;
            auVar126 = vsubps_avx(auVar179,auVar64);
            local_5a0._0_4_ =
                 (float)((uint)(bVar101 & 1) * (int)fVar196 |
                        (uint)!(bool)(bVar101 & 1) * auVar126._0_4_);
            bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
            local_5a0._4_4_ = (float)((uint)bVar18 * (int)fVar211 | (uint)!bVar18 * auVar126._4_4_);
            bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
            local_5a0._8_4_ = (float)((uint)bVar18 * (int)fVar113 | (uint)!bVar18 * auVar126._8_4_);
            bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
            local_5a0._12_4_ =
                 (float)((uint)bVar18 * (int)fVar195 | (uint)!bVar18 * auVar126._12_4_);
            bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
            local_5a0._16_4_ =
                 (float)((uint)bVar18 * (int)fVar166 | (uint)!bVar18 * auVar126._16_4_);
            bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
            local_5a0._20_4_ =
                 (float)((uint)bVar18 * (int)fVar167 | (uint)!bVar18 * auVar126._20_4_);
            bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
            local_5a0._24_4_ =
                 (float)((uint)bVar18 * (int)fVar168 | (uint)!bVar18 * auVar126._24_4_);
            bVar18 = SUB81(uVar102 >> 7,0);
            local_5a0._28_4_ =
                 (float)((uint)bVar18 * auVar124._28_4_ | (uint)!bVar18 * auVar126._28_4_);
            auVar126 = vsubps_avx(auVar134,auVar133);
            auVar119 = vfmadd213ps_fma(auVar126,local_5a0,auVar133);
            uVar175 = *(undefined4 *)((long)pre->ray_space + sVar111 * 4 + -0x40);
            auVar41._4_4_ = uVar175;
            auVar41._0_4_ = uVar175;
            auVar41._8_4_ = uVar175;
            auVar41._12_4_ = uVar175;
            auVar41._16_4_ = uVar175;
            auVar41._20_4_ = uVar175;
            auVar41._24_4_ = uVar175;
            auVar41._28_4_ = uVar175;
            auVar126 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar119._12_4_ + auVar119._12_4_,
                                                          CONCAT48(auVar119._8_4_ + auVar119._8_4_,
                                                                   CONCAT44(auVar119._4_4_ +
                                                                            auVar119._4_4_,
                                                                            auVar119._0_4_ +
                                                                            auVar119._0_4_)))),
                                       auVar41);
            uVar36 = vcmpps_avx512vl(local_560,auVar126,6);
            uVar109 = uVar109 & uVar36;
            bVar112 = (byte)uVar109;
            if (bVar112 != 0) {
              auVar193._0_4_ = auVar125._0_4_ * fVar174;
              auVar193._4_4_ = auVar125._4_4_ * fVar187;
              auVar193._8_4_ = auVar125._8_4_ * fVar188;
              auVar193._12_4_ = auVar125._12_4_ * fVar197;
              auVar193._16_4_ = auVar125._16_4_ * 0.0;
              auVar193._20_4_ = auVar125._20_4_ * 0.0;
              auVar193._24_4_ = auVar125._24_4_ * 0.0;
              auVar193._28_4_ = 0;
              auVar208._8_4_ = 0x3f800000;
              auVar208._0_8_ = 0x3f8000003f800000;
              auVar208._12_4_ = 0x3f800000;
              auVar208._16_4_ = 0x3f800000;
              auVar208._20_4_ = 0x3f800000;
              auVar208._24_4_ = 0x3f800000;
              auVar208._28_4_ = 0x3f800000;
              auVar126 = vsubps_avx(auVar208,auVar193);
              auVar150._0_4_ =
                   (uint)(bVar101 & 1) * (int)auVar193._0_4_ |
                   (uint)!(bool)(bVar101 & 1) * auVar126._0_4_;
              bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
              auVar150._4_4_ = (uint)bVar18 * (int)auVar193._4_4_ | (uint)!bVar18 * auVar126._4_4_;
              bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
              auVar150._8_4_ = (uint)bVar18 * (int)auVar193._8_4_ | (uint)!bVar18 * auVar126._8_4_;
              bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
              auVar150._12_4_ =
                   (uint)bVar18 * (int)auVar193._12_4_ | (uint)!bVar18 * auVar126._12_4_;
              bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
              auVar150._16_4_ =
                   (uint)bVar18 * (int)auVar193._16_4_ | (uint)!bVar18 * auVar126._16_4_;
              bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
              auVar150._20_4_ =
                   (uint)bVar18 * (int)auVar193._20_4_ | (uint)!bVar18 * auVar126._20_4_;
              bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
              auVar150._24_4_ =
                   (uint)bVar18 * (int)auVar193._24_4_ | (uint)!bVar18 * auVar126._24_4_;
              auVar150._28_4_ = (uint)!SUB81(uVar102 >> 7,0) * auVar126._28_4_;
              auVar42._8_4_ = 0x40000000;
              auVar42._0_8_ = 0x4000000040000000;
              auVar42._12_4_ = 0x40000000;
              auVar42._16_4_ = 0x40000000;
              auVar42._20_4_ = 0x40000000;
              auVar42._24_4_ = 0x40000000;
              auVar42._28_4_ = 0x40000000;
              local_580 = vfmsub132ps_avx512vl(auVar150,auVar208,auVar42);
              local_540 = 0;
              if ((pGVar107->mask & *(uint *)(ray + sVar111 * 4 + 0x240)) != 0) {
                fVar190 = 1.0 / auVar231._0_4_;
                local_4e0[0] = fVar190 * (local_5a0._0_4_ + 0.0);
                local_4e0[1] = fVar190 * (local_5a0._4_4_ + 1.0);
                local_4e0[2] = fVar190 * (local_5a0._8_4_ + 2.0);
                local_4e0[3] = fVar190 * (local_5a0._12_4_ + 3.0);
                fStack_4d0 = fVar190 * (local_5a0._16_4_ + 4.0);
                fStack_4cc = fVar190 * (local_5a0._20_4_ + 5.0);
                fStack_4c8 = fVar190 * (local_5a0._24_4_ + 6.0);
                fStack_4c4 = local_5a0._28_4_ + 7.0;
                local_4c0 = local_580;
                local_4a0 = local_560;
                auVar180._8_4_ = 0x7f800000;
                auVar180._0_8_ = 0x7f8000007f800000;
                auVar180._12_4_ = 0x7f800000;
                auVar180._16_4_ = 0x7f800000;
                auVar180._20_4_ = 0x7f800000;
                auVar180._24_4_ = 0x7f800000;
                auVar180._28_4_ = 0x7f800000;
                auVar126 = vblendmps_avx512vl(auVar180,local_560);
                auVar151._0_4_ =
                     (uint)(bVar112 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar112 & 1) * 0x7f800000;
                bVar18 = (bool)((byte)(uVar109 >> 1) & 1);
                auVar151._4_4_ = (uint)bVar18 * auVar126._4_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar109 >> 2) & 1);
                auVar151._8_4_ = (uint)bVar18 * auVar126._8_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar109 >> 3) & 1);
                auVar151._12_4_ = (uint)bVar18 * auVar126._12_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar109 >> 4) & 1);
                auVar151._16_4_ = (uint)bVar18 * auVar126._16_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar109 >> 5) & 1);
                auVar151._20_4_ = (uint)bVar18 * auVar126._20_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar109 >> 6) & 1);
                auVar151._24_4_ = (uint)bVar18 * auVar126._24_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = SUB81(uVar109 >> 7,0);
                auVar151._28_4_ = (uint)bVar18 * auVar126._28_4_ | (uint)!bVar18 * 0x7f800000;
                auVar126 = vshufps_avx(auVar151,auVar151,0xb1);
                auVar126 = vminps_avx(auVar151,auVar126);
                auVar127 = vshufpd_avx(auVar126,auVar126,5);
                auVar126 = vminps_avx(auVar126,auVar127);
                auVar127 = vpermpd_avx2(auVar126,0x4e);
                auVar126 = vminps_avx(auVar126,auVar127);
                uVar34 = vcmpps_avx512vl(auVar151,auVar126,0);
                uVar103 = (uint)uVar109;
                if ((bVar112 & (byte)uVar34) != 0) {
                  uVar103 = (uint)(bVar112 & (byte)uVar34);
                }
                uVar104 = 0;
                for (; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x80000000) {
                  uVar104 = uVar104 + 1;
                }
                uVar102 = (ulong)uVar104;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar107->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_740 = *(float *)(ray + sVar111 * 4 + 0x200);
                  fStack_73c = 0.0;
                  fStack_738 = 0.0;
                  fStack_734 = 0.0;
                  local_7e0 = auVar128;
                  local_7c0 = local_560;
                  local_53c = iVar15;
                  local_530 = auVar32;
                  local_520 = uVar33;
                  uStack_518 = uVar37;
                  local_510 = uVar95;
                  uStack_508 = uVar96;
                  local_500 = uVar97;
                  uStack_4f8 = uVar98;
                  do {
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_4e0[uVar102]));
                    local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_4c0 + uVar102 * 4)));
                    *(undefined4 *)(ray + sVar111 * 4 + 0x200) =
                         *(undefined4 *)(local_4a0 + uVar102 * 4);
                    local_840.context = context->user;
                    fVar174 = local_200._0_4_;
                    fVar190 = 1.0 - fVar174;
                    auVar206 = vfnmadd231ss_fma(ZEXT416((uint)(fVar174 * (fVar190 + fVar190))),
                                                ZEXT416((uint)fVar190),ZEXT416((uint)fVar190));
                    auVar118 = local_200._0_16_;
                    auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar118,
                                               ZEXT416(0xc0a00000));
                    auVar120 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174 * 3.0)),
                                               ZEXT416((uint)(fVar174 + fVar174)),auVar119);
                    auVar225 = ZEXT1664(auVar120);
                    auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar118,
                                               ZEXT416(0x40000000));
                    auVar119 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * -3.0)),
                                               ZEXT416((uint)(fVar190 + fVar190)),auVar119);
                    auVar118 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174)),auVar118,
                                               ZEXT416((uint)(fVar190 * -2.0)));
                    fVar190 = auVar206._0_4_ * 0.5;
                    fVar174 = auVar120._0_4_ * 0.5;
                    fVar187 = auVar119._0_4_ * 0.5;
                    fVar188 = auVar118._0_4_ * 0.5;
                    auVar206._0_4_ = fVar188 * local_8a0;
                    auVar206._4_4_ = fVar188 * fStack_89c;
                    auVar206._8_4_ = fVar188 * fStack_898;
                    auVar206._12_4_ = fVar188 * fStack_894;
                    auVar221._4_4_ = fVar187;
                    auVar221._0_4_ = fVar187;
                    auVar221._8_4_ = fVar187;
                    auVar221._12_4_ = fVar187;
                    auVar119 = vfmadd132ps_fma(auVar221,auVar206,auVar176);
                    auVar117._4_4_ = fVar174;
                    auVar117._0_4_ = fVar174;
                    auVar117._8_4_ = fVar174;
                    auVar117._12_4_ = fVar174;
                    auVar119 = vfmadd132ps_fma(auVar117,auVar119,auVar8);
                    auVar118._4_4_ = fVar190;
                    auVar118._0_4_ = fVar190;
                    auVar118._8_4_ = fVar190;
                    auVar118._12_4_ = fVar190;
                    auVar119 = vfmadd213ps_fma(auVar118,auVar32,auVar119);
                    auVar165 = vbroadcastss_avx512f(auVar119);
                    auVar217 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar217 = vpermps_avx512f(auVar217,ZEXT1664(auVar119));
                    auVar222 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar222,ZEXT1664(auVar119));
                    local_2c0[0] = (RTCHitN)auVar165[0];
                    local_2c0[1] = (RTCHitN)auVar165[1];
                    local_2c0[2] = (RTCHitN)auVar165[2];
                    local_2c0[3] = (RTCHitN)auVar165[3];
                    local_2c0[4] = (RTCHitN)auVar165[4];
                    local_2c0[5] = (RTCHitN)auVar165[5];
                    local_2c0[6] = (RTCHitN)auVar165[6];
                    local_2c0[7] = (RTCHitN)auVar165[7];
                    local_2c0[8] = (RTCHitN)auVar165[8];
                    local_2c0[9] = (RTCHitN)auVar165[9];
                    local_2c0[10] = (RTCHitN)auVar165[10];
                    local_2c0[0xb] = (RTCHitN)auVar165[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar165[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar165[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar165[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar165[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar165[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar165[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar165[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar165[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar165[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar165[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar165[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar165[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar165[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar165[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar165[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar165[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar165[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar165[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar165[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar165[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar165[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar165[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar165[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar165[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar165[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar165[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar165[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar165[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar165[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar165[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar165[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar165[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar165[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar165[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar165[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar165[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar165[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar165[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar165[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar165[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar165[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar165[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar165[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar165[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar165[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar165[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar165[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar165[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar165[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar165[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar165[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar165[0x3f];
                    local_280 = auVar217;
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar165 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar165);
                    auVar128 = vpcmpeqd_avx2(auVar165._0_32_,auVar165._0_32_);
                    local_7f0[3] = auVar128;
                    local_7f0[2] = auVar128;
                    local_7f0[1] = auVar128;
                    *local_7f0 = auVar128;
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instPrimID[0]));
                    auVar165 = vmovdqa64_avx512f(local_380);
                    local_700 = vmovdqa64_avx512f(auVar165);
                    local_840.valid = (int *)local_700;
                    local_840.geometryUserPtr = pGVar107->userPtr;
                    local_840.hit = local_2c0;
                    local_840.N = 0x10;
                    local_840.ray = (RTCRayN *)ray;
                    if (pGVar107->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar217 = ZEXT1664(auVar217._0_16_);
                      auVar222 = ZEXT1664(auVar222._0_16_);
                      auVar225 = ZEXT1664(auVar120);
                      (*pGVar107->intersectionFilterN)(&local_840);
                      auVar230 = ZEXT3264(local_7c0);
                      auVar186 = ZEXT3264(local_7e0);
                      auVar240 = ZEXT3264(local_780);
                      auVar239 = ZEXT3264(local_760);
                      auVar165 = vmovdqa64_avx512f(local_700);
                      sVar111 = local_7f8;
                    }
                    uVar34 = vptestmd_avx512f(auVar165,auVar165);
                    if ((short)uVar34 == 0) {
LAB_01a5b9c6:
                      *(float *)(ray + sVar111 * 4 + 0x200) = local_740;
                    }
                    else {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar107->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar217 = ZEXT1664(auVar217._0_16_);
                        auVar222 = ZEXT1664(auVar222._0_16_);
                        auVar225 = ZEXT1664(auVar225._0_16_);
                        (*p_Var17)(&local_840);
                        auVar230 = ZEXT3264(local_7c0);
                        auVar186 = ZEXT3264(local_7e0);
                        auVar240 = ZEXT3264(local_780);
                        auVar239 = ZEXT3264(local_760);
                        auVar165 = vmovdqa64_avx512f(local_700);
                        sVar111 = local_7f8;
                      }
                      uVar36 = vptestmd_avx512f(auVar165,auVar165);
                      if ((short)uVar36 == 0) goto LAB_01a5b9c6;
                      iVar1 = *(int *)(local_840.hit + 4);
                      iVar2 = *(int *)(local_840.hit + 8);
                      iVar82 = *(int *)(local_840.hit + 0xc);
                      iVar83 = *(int *)(local_840.hit + 0x10);
                      iVar84 = *(int *)(local_840.hit + 0x14);
                      iVar85 = *(int *)(local_840.hit + 0x18);
                      iVar86 = *(int *)(local_840.hit + 0x1c);
                      iVar87 = *(int *)(local_840.hit + 0x20);
                      iVar88 = *(int *)(local_840.hit + 0x24);
                      iVar89 = *(int *)(local_840.hit + 0x28);
                      iVar90 = *(int *)(local_840.hit + 0x2c);
                      iVar91 = *(int *)(local_840.hit + 0x30);
                      iVar92 = *(int *)(local_840.hit + 0x34);
                      iVar93 = *(int *)(local_840.hit + 0x38);
                      iVar94 = *(int *)(local_840.hit + 0x3c);
                      bVar112 = (byte)uVar36;
                      bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                      bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                      bVar101 = (byte)(uVar36 >> 8);
                      bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                      bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                      bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                      bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                      bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                      bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                      bVar31 = SUB81(uVar36 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x300) =
                           (uint)(bVar112 & 1) * *(int *)local_840.hit |
                           (uint)!(bool)(bVar112 & 1) * *(int *)(local_840.ray + 0x300);
                      *(uint *)(local_840.ray + 0x304) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_840.ray + 0x304);
                      *(uint *)(local_840.ray + 0x308) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_840.ray + 0x308);
                      *(uint *)(local_840.ray + 0x30c) =
                           (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_840.ray + 0x30c);
                      *(uint *)(local_840.ray + 0x310) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_840.ray + 0x310);
                      *(uint *)(local_840.ray + 0x314) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_840.ray + 0x314);
                      *(uint *)(local_840.ray + 0x318) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_840.ray + 0x318);
                      *(uint *)(local_840.ray + 0x31c) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x31c);
                      *(uint *)(local_840.ray + 800) =
                           (uint)(bVar101 & 1) * iVar87 |
                           (uint)!(bool)(bVar101 & 1) * *(int *)(local_840.ray + 800);
                      *(uint *)(local_840.ray + 0x324) =
                           (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_840.ray + 0x324);
                      *(uint *)(local_840.ray + 0x328) =
                           (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_840.ray + 0x328);
                      *(uint *)(local_840.ray + 0x32c) =
                           (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_840.ray + 0x32c);
                      *(uint *)(local_840.ray + 0x330) =
                           (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_840.ray + 0x330);
                      *(uint *)(local_840.ray + 0x334) =
                           (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_840.ray + 0x334);
                      *(uint *)(local_840.ray + 0x338) =
                           (uint)bVar30 * iVar93 | (uint)!bVar30 * *(int *)(local_840.ray + 0x338);
                      *(uint *)(local_840.ray + 0x33c) =
                           (uint)bVar31 * iVar94 | (uint)!bVar31 * *(int *)(local_840.ray + 0x33c);
                      iVar1 = *(int *)(local_840.hit + 0x44);
                      iVar2 = *(int *)(local_840.hit + 0x48);
                      iVar82 = *(int *)(local_840.hit + 0x4c);
                      iVar83 = *(int *)(local_840.hit + 0x50);
                      iVar84 = *(int *)(local_840.hit + 0x54);
                      iVar85 = *(int *)(local_840.hit + 0x58);
                      iVar86 = *(int *)(local_840.hit + 0x5c);
                      iVar87 = *(int *)(local_840.hit + 0x60);
                      iVar88 = *(int *)(local_840.hit + 100);
                      iVar89 = *(int *)(local_840.hit + 0x68);
                      iVar90 = *(int *)(local_840.hit + 0x6c);
                      iVar91 = *(int *)(local_840.hit + 0x70);
                      iVar92 = *(int *)(local_840.hit + 0x74);
                      iVar93 = *(int *)(local_840.hit + 0x78);
                      iVar94 = *(int *)(local_840.hit + 0x7c);
                      bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                      bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                      bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                      bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                      bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                      bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                      bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                      bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                      bVar31 = SUB81(uVar36 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x340) =
                           (uint)(bVar112 & 1) * *(int *)(local_840.hit + 0x40) |
                           (uint)!(bool)(bVar112 & 1) * *(int *)(local_840.ray + 0x340);
                      *(uint *)(local_840.ray + 0x344) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_840.ray + 0x344);
                      *(uint *)(local_840.ray + 0x348) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_840.ray + 0x348);
                      *(uint *)(local_840.ray + 0x34c) =
                           (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_840.ray + 0x34c);
                      *(uint *)(local_840.ray + 0x350) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_840.ray + 0x350);
                      *(uint *)(local_840.ray + 0x354) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_840.ray + 0x354);
                      *(uint *)(local_840.ray + 0x358) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_840.ray + 0x358);
                      *(uint *)(local_840.ray + 0x35c) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x35c);
                      *(uint *)(local_840.ray + 0x360) =
                           (uint)(bVar101 & 1) * iVar87 |
                           (uint)!(bool)(bVar101 & 1) * *(int *)(local_840.ray + 0x360);
                      *(uint *)(local_840.ray + 0x364) =
                           (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_840.ray + 0x364);
                      *(uint *)(local_840.ray + 0x368) =
                           (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_840.ray + 0x368);
                      *(uint *)(local_840.ray + 0x36c) =
                           (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_840.ray + 0x36c);
                      *(uint *)(local_840.ray + 0x370) =
                           (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_840.ray + 0x370);
                      *(uint *)(local_840.ray + 0x374) =
                           (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_840.ray + 0x374);
                      *(uint *)(local_840.ray + 0x378) =
                           (uint)bVar30 * iVar93 | (uint)!bVar30 * *(int *)(local_840.ray + 0x378);
                      *(uint *)(local_840.ray + 0x37c) =
                           (uint)bVar31 * iVar94 | (uint)!bVar31 * *(int *)(local_840.ray + 0x37c);
                      iVar1 = *(int *)(local_840.hit + 0x84);
                      iVar2 = *(int *)(local_840.hit + 0x88);
                      iVar82 = *(int *)(local_840.hit + 0x8c);
                      iVar83 = *(int *)(local_840.hit + 0x90);
                      iVar84 = *(int *)(local_840.hit + 0x94);
                      iVar85 = *(int *)(local_840.hit + 0x98);
                      iVar86 = *(int *)(local_840.hit + 0x9c);
                      iVar87 = *(int *)(local_840.hit + 0xa0);
                      iVar88 = *(int *)(local_840.hit + 0xa4);
                      iVar89 = *(int *)(local_840.hit + 0xa8);
                      iVar90 = *(int *)(local_840.hit + 0xac);
                      iVar91 = *(int *)(local_840.hit + 0xb0);
                      iVar92 = *(int *)(local_840.hit + 0xb4);
                      iVar93 = *(int *)(local_840.hit + 0xb8);
                      iVar94 = *(int *)(local_840.hit + 0xbc);
                      bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                      bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                      bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                      bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                      bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                      bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                      bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                      bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                      bVar31 = SUB81(uVar36 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x380) =
                           (uint)(bVar112 & 1) * *(int *)(local_840.hit + 0x80) |
                           (uint)!(bool)(bVar112 & 1) * *(int *)(local_840.ray + 0x380);
                      *(uint *)(local_840.ray + 900) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_840.ray + 900);
                      *(uint *)(local_840.ray + 0x388) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_840.ray + 0x388);
                      *(uint *)(local_840.ray + 0x38c) =
                           (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_840.ray + 0x38c);
                      *(uint *)(local_840.ray + 0x390) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_840.ray + 0x390);
                      *(uint *)(local_840.ray + 0x394) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_840.ray + 0x394);
                      *(uint *)(local_840.ray + 0x398) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_840.ray + 0x398);
                      *(uint *)(local_840.ray + 0x39c) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x39c);
                      *(uint *)(local_840.ray + 0x3a0) =
                           (uint)(bVar101 & 1) * iVar87 |
                           (uint)!(bool)(bVar101 & 1) * *(int *)(local_840.ray + 0x3a0);
                      *(uint *)(local_840.ray + 0x3a4) =
                           (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_840.ray + 0x3a4);
                      *(uint *)(local_840.ray + 0x3a8) =
                           (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_840.ray + 0x3a8);
                      *(uint *)(local_840.ray + 0x3ac) =
                           (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_840.ray + 0x3ac);
                      *(uint *)(local_840.ray + 0x3b0) =
                           (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_840.ray + 0x3b0);
                      *(uint *)(local_840.ray + 0x3b4) =
                           (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_840.ray + 0x3b4);
                      *(uint *)(local_840.ray + 0x3b8) =
                           (uint)bVar30 * iVar93 | (uint)!bVar30 * *(int *)(local_840.ray + 0x3b8);
                      *(uint *)(local_840.ray + 0x3bc) =
                           (uint)bVar31 * iVar94 | (uint)!bVar31 * *(int *)(local_840.ray + 0x3bc);
                      iVar1 = *(int *)(local_840.hit + 0xc4);
                      iVar2 = *(int *)(local_840.hit + 200);
                      iVar82 = *(int *)(local_840.hit + 0xcc);
                      iVar83 = *(int *)(local_840.hit + 0xd0);
                      iVar84 = *(int *)(local_840.hit + 0xd4);
                      iVar85 = *(int *)(local_840.hit + 0xd8);
                      iVar86 = *(int *)(local_840.hit + 0xdc);
                      iVar87 = *(int *)(local_840.hit + 0xe0);
                      iVar88 = *(int *)(local_840.hit + 0xe4);
                      iVar89 = *(int *)(local_840.hit + 0xe8);
                      iVar90 = *(int *)(local_840.hit + 0xec);
                      iVar91 = *(int *)(local_840.hit + 0xf0);
                      iVar92 = *(int *)(local_840.hit + 0xf4);
                      iVar93 = *(int *)(local_840.hit + 0xf8);
                      iVar94 = *(int *)(local_840.hit + 0xfc);
                      bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                      bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                      bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                      bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                      bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                      bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                      bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                      bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                      bVar31 = SUB81(uVar36 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x3c0) =
                           (uint)(bVar112 & 1) * *(int *)(local_840.hit + 0xc0) |
                           (uint)!(bool)(bVar112 & 1) * *(int *)(local_840.ray + 0x3c0);
                      *(uint *)(local_840.ray + 0x3c4) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_840.ray + 0x3c4);
                      *(uint *)(local_840.ray + 0x3c8) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_840.ray + 0x3c8);
                      *(uint *)(local_840.ray + 0x3cc) =
                           (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_840.ray + 0x3cc);
                      *(uint *)(local_840.ray + 0x3d0) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_840.ray + 0x3d0);
                      *(uint *)(local_840.ray + 0x3d4) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_840.ray + 0x3d4);
                      *(uint *)(local_840.ray + 0x3d8) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_840.ray + 0x3d8);
                      *(uint *)(local_840.ray + 0x3dc) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x3dc);
                      *(uint *)(local_840.ray + 0x3e0) =
                           (uint)(bVar101 & 1) * iVar87 |
                           (uint)!(bool)(bVar101 & 1) * *(int *)(local_840.ray + 0x3e0);
                      *(uint *)(local_840.ray + 0x3e4) =
                           (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_840.ray + 0x3e4);
                      *(uint *)(local_840.ray + 1000) =
                           (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_840.ray + 1000);
                      *(uint *)(local_840.ray + 0x3ec) =
                           (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_840.ray + 0x3ec);
                      *(uint *)(local_840.ray + 0x3f0) =
                           (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_840.ray + 0x3f0);
                      *(uint *)(local_840.ray + 0x3f4) =
                           (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_840.ray + 0x3f4);
                      *(uint *)(local_840.ray + 0x3f8) =
                           (uint)bVar30 * iVar93 | (uint)!bVar30 * *(int *)(local_840.ray + 0x3f8);
                      *(uint *)(local_840.ray + 0x3fc) =
                           (uint)bVar31 * iVar94 | (uint)!bVar31 * *(int *)(local_840.ray + 0x3fc);
                      iVar1 = *(int *)(local_840.hit + 0x104);
                      iVar2 = *(int *)(local_840.hit + 0x108);
                      iVar82 = *(int *)(local_840.hit + 0x10c);
                      iVar83 = *(int *)(local_840.hit + 0x110);
                      iVar84 = *(int *)(local_840.hit + 0x114);
                      iVar85 = *(int *)(local_840.hit + 0x118);
                      iVar86 = *(int *)(local_840.hit + 0x11c);
                      iVar87 = *(int *)(local_840.hit + 0x120);
                      iVar88 = *(int *)(local_840.hit + 0x124);
                      iVar89 = *(int *)(local_840.hit + 0x128);
                      iVar90 = *(int *)(local_840.hit + 300);
                      iVar91 = *(int *)(local_840.hit + 0x130);
                      iVar92 = *(int *)(local_840.hit + 0x134);
                      iVar93 = *(int *)(local_840.hit + 0x138);
                      iVar94 = *(int *)(local_840.hit + 0x13c);
                      bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                      bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                      bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                      bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                      bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                      bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                      bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                      bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                      bVar31 = SUB81(uVar36 >> 0xf,0);
                      *(uint *)(local_840.ray + 0x400) =
                           (uint)(bVar112 & 1) * *(int *)(local_840.hit + 0x100) |
                           (uint)!(bool)(bVar112 & 1) * *(int *)(local_840.ray + 0x400);
                      *(uint *)(local_840.ray + 0x404) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_840.ray + 0x404);
                      *(uint *)(local_840.ray + 0x408) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_840.ray + 0x408);
                      *(uint *)(local_840.ray + 0x40c) =
                           (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_840.ray + 0x40c);
                      *(uint *)(local_840.ray + 0x410) =
                           (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_840.ray + 0x410);
                      *(uint *)(local_840.ray + 0x414) =
                           (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_840.ray + 0x414);
                      *(uint *)(local_840.ray + 0x418) =
                           (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_840.ray + 0x418);
                      *(uint *)(local_840.ray + 0x41c) =
                           (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_840.ray + 0x41c);
                      *(uint *)(local_840.ray + 0x420) =
                           (uint)(bVar101 & 1) * iVar87 |
                           (uint)!(bool)(bVar101 & 1) * *(int *)(local_840.ray + 0x420);
                      *(uint *)(local_840.ray + 0x424) =
                           (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_840.ray + 0x424);
                      *(uint *)(local_840.ray + 0x428) =
                           (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_840.ray + 0x428);
                      *(uint *)(local_840.ray + 0x42c) =
                           (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_840.ray + 0x42c);
                      *(uint *)(local_840.ray + 0x430) =
                           (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_840.ray + 0x430);
                      *(uint *)(local_840.ray + 0x434) =
                           (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_840.ray + 0x434);
                      *(uint *)(local_840.ray + 0x438) =
                           (uint)bVar30 * iVar93 | (uint)!bVar30 * *(int *)(local_840.ray + 0x438);
                      *(uint *)(local_840.ray + 0x43c) =
                           (uint)bVar31 * iVar94 | (uint)!bVar31 * *(int *)(local_840.ray + 0x43c);
                      auVar165 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x140));
                      auVar165 = vmovdqu32_avx512f(auVar165);
                      *(undefined1 (*) [64])(local_840.ray + 0x440) = auVar165;
                      auVar165 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x180));
                      auVar165 = vmovdqu32_avx512f(auVar165);
                      *(undefined1 (*) [64])(local_840.ray + 0x480) = auVar165;
                      auVar165 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x1c0));
                      auVar165 = vmovdqa32_avx512f(auVar165);
                      *(undefined1 (*) [64])(local_840.ray + 0x4c0) = auVar165;
                      auVar165 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x200));
                      auVar165 = vmovdqa32_avx512f(auVar165);
                      *(undefined1 (*) [64])(local_840.ray + 0x500) = auVar165;
                      local_740 = *(float *)(ray + sVar111 * 4 + 0x200);
                      fStack_73c = 0.0;
                      fStack_738 = 0.0;
                      fStack_734 = 0.0;
                    }
                    auVar128 = auVar186._0_32_;
                    bVar112 = ~(byte)(1 << ((uint)uVar102 & 0x1f)) & (byte)uVar109;
                    auVar184._4_4_ = local_740;
                    auVar184._0_4_ = local_740;
                    auVar184._8_4_ = local_740;
                    auVar184._12_4_ = local_740;
                    auVar184._16_4_ = local_740;
                    auVar184._20_4_ = local_740;
                    auVar184._24_4_ = local_740;
                    auVar184._28_4_ = local_740;
                    uVar34 = vcmpps_avx512vl(auVar230._0_32_,auVar184,2);
                    if ((bVar112 & (byte)uVar34) == 0) goto LAB_01a5a81c;
                    bVar112 = bVar112 & (byte)uVar34;
                    uVar109 = (ulong)bVar112;
                    auVar185._8_4_ = 0x7f800000;
                    auVar185._0_8_ = 0x7f8000007f800000;
                    auVar185._12_4_ = 0x7f800000;
                    auVar185._16_4_ = 0x7f800000;
                    auVar185._20_4_ = 0x7f800000;
                    auVar185._24_4_ = 0x7f800000;
                    auVar185._28_4_ = 0x7f800000;
                    auVar128 = vblendmps_avx512vl(auVar185,auVar230._0_32_);
                    auVar164._0_4_ =
                         (uint)(bVar112 & 1) * auVar128._0_4_ |
                         (uint)!(bool)(bVar112 & 1) * 0x7f800000;
                    bVar18 = (bool)(bVar112 >> 1 & 1);
                    auVar164._4_4_ = (uint)bVar18 * auVar128._4_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar112 >> 2 & 1);
                    auVar164._8_4_ = (uint)bVar18 * auVar128._8_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar112 >> 3 & 1);
                    auVar164._12_4_ = (uint)bVar18 * auVar128._12_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar112 >> 4 & 1);
                    auVar164._16_4_ = (uint)bVar18 * auVar128._16_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar112 >> 5 & 1);
                    auVar164._20_4_ = (uint)bVar18 * auVar128._20_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar112 >> 6 & 1);
                    auVar164._24_4_ = (uint)bVar18 * auVar128._24_4_ | (uint)!bVar18 * 0x7f800000;
                    auVar164._28_4_ =
                         (uint)(bVar112 >> 7) * auVar128._28_4_ |
                         (uint)!(bool)(bVar112 >> 7) * 0x7f800000;
                    auVar128 = vshufps_avx(auVar164,auVar164,0xb1);
                    auVar128 = vminps_avx(auVar164,auVar128);
                    auVar126 = vshufpd_avx(auVar128,auVar128,5);
                    auVar128 = vminps_avx(auVar128,auVar126);
                    auVar126 = vpermpd_avx2(auVar128,0x4e);
                    auVar128 = vminps_avx(auVar128,auVar126);
                    uVar34 = vcmpps_avx512vl(auVar164,auVar128,0);
                    bVar101 = (byte)uVar34 & bVar112;
                    if (bVar101 != 0) {
                      bVar112 = bVar101;
                    }
                    uVar103 = 0;
                    for (uVar104 = (uint)bVar112; (uVar104 & 1) == 0;
                        uVar104 = uVar104 >> 1 | 0x80000000) {
                      uVar103 = uVar103 + 1;
                    }
                    uVar102 = (ulong)uVar103;
                  } while( true );
                }
                fVar190 = local_4e0[uVar102];
                uVar175 = *(undefined4 *)(local_4c0 + uVar102 * 4);
                fVar174 = 1.0 - fVar190;
                auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar190 * (fVar174 + fVar174))),
                                          ZEXT416((uint)fVar174),ZEXT416((uint)fVar174));
                auVar176 = ZEXT416((uint)fVar190);
                auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar176,
                                           ZEXT416(0xc0a00000));
                auVar120 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * 3.0)),
                                           ZEXT416((uint)(fVar190 + fVar190)),auVar119);
                auVar225 = ZEXT1664(auVar120);
                auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar176,
                                           ZEXT416(0x40000000));
                auVar119 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174 * -3.0)),
                                           ZEXT416((uint)(fVar174 + fVar174)),auVar119);
                auVar176 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),auVar176,
                                           ZEXT416((uint)(fVar174 * -2.0)));
                fVar174 = auVar8._0_4_ * 0.5;
                fVar187 = auVar120._0_4_ * 0.5;
                auVar217 = ZEXT464((uint)fVar187);
                fVar188 = auVar119._0_4_ * 0.5;
                fVar197 = auVar176._0_4_ * 0.5;
                auVar200._0_4_ = fVar197 * local_8a0;
                auVar200._4_4_ = fVar197 * fStack_89c;
                auVar200._8_4_ = fVar197 * fStack_898;
                auVar200._12_4_ = fVar197 * fStack_894;
                auVar218._4_4_ = fVar188;
                auVar218._0_4_ = fVar188;
                auVar218._8_4_ = fVar188;
                auVar218._12_4_ = fVar188;
                auVar119 = vfmadd132ps_fma(auVar218,auVar200,*pauVar4);
                auVar222 = ZEXT1664(auVar119);
                auVar201._4_4_ = fVar187;
                auVar201._0_4_ = fVar187;
                auVar201._8_4_ = fVar187;
                auVar201._12_4_ = fVar187;
                auVar119 = vfmadd132ps_fma(auVar201,auVar119,*pauVar3);
                auVar191._4_4_ = fVar174;
                auVar191._0_4_ = fVar174;
                auVar191._8_4_ = fVar174;
                auVar191._12_4_ = fVar174;
                auVar119 = vfmadd213ps_fma(auVar191,auVar32,auVar119);
                *(undefined4 *)(ray + sVar111 * 4 + 0x200) =
                     *(undefined4 *)(local_4a0 + uVar102 * 4);
                *(int *)(ray + sVar111 * 4 + 0x300) = auVar119._0_4_;
                uVar16 = vextractps_avx(auVar119,1);
                *(undefined4 *)(ray + sVar111 * 4 + 0x340) = uVar16;
                uVar16 = vextractps_avx(auVar119,2);
                *(undefined4 *)(ray + sVar111 * 4 + 0x380) = uVar16;
                *(float *)(ray + sVar111 * 4 + 0x3c0) = fVar190;
                *(undefined4 *)(ray + sVar111 * 4 + 0x400) = uVar175;
                *(uint *)(ray + sVar111 * 4 + 0x440) = uVar14;
                *(uint *)(ray + sVar111 * 4 + 0x480) = uVar13;
                *(uint *)(ray + sVar111 * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + sVar111 * 4 + 0x500) = context->user->instPrimID[0];
LAB_01a5a81c:
                fVar190 = (float)local_810._0_4_;
              }
            }
          }
        }
      }
    }
    local_810._0_4_ = fVar190;
    if (8 < iVar15) {
      auVar126 = vpbroadcastd_avx512vl();
      auVar186 = ZEXT3264(auVar126);
      local_740 = (float)local_810._0_4_;
      fStack_73c = (float)local_810._0_4_;
      fStack_738 = (float)local_810._0_4_;
      fStack_734 = (float)local_810._0_4_;
      fStack_730 = (float)local_810._0_4_;
      fStack_72c = (float)local_810._0_4_;
      fStack_728 = (float)local_810._0_4_;
      fStack_724 = (float)local_810._0_4_;
      uStack_71c = local_720;
      uStack_718 = local_720;
      uStack_714 = local_720;
      uStack_710 = local_720;
      uStack_70c = local_720;
      uStack_708 = local_720;
      uStack_704 = local_720;
      local_440 = 1.0 / (float)local_7a0._0_4_;
      fStack_43c = local_440;
      fStack_438 = local_440;
      fStack_434 = local_440;
      fStack_430 = local_440;
      fStack_42c = local_440;
      fStack_428 = local_440;
      fStack_424 = local_440;
      lVar106 = 8;
      local_7e0 = auVar128;
LAB_01a5a8ba:
      if (lVar106 < lVar105) {
        auVar128 = vpbroadcastd_avx512vl();
        auVar128 = vpor_avx2(auVar128,_DAT_01fb4ba0);
        uVar35 = vpcmpgtd_avx512vl(auVar186._0_32_,auVar128);
        auVar128 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar106 * 4 + lVar110);
        auVar126 = *(undefined1 (*) [32])(lVar110 + 0x22047f0 + lVar106 * 4);
        auVar127 = *(undefined1 (*) [32])(lVar110 + 0x2204c74 + lVar106 * 4);
        auVar139 = *(undefined1 (*) [32])(lVar110 + 0x22050f8 + lVar106 * 4);
        auVar230._0_4_ = auVar139._0_4_ * (float)local_680._0_4_;
        auVar230._4_4_ = auVar139._4_4_ * (float)local_680._4_4_;
        auVar230._8_4_ = auVar139._8_4_ * fStack_678;
        auVar230._12_4_ = auVar139._12_4_ * fStack_674;
        auVar230._16_4_ = auVar139._16_4_ * fStack_670;
        auVar230._20_4_ = auVar139._20_4_ * fStack_66c;
        auVar230._28_36_ = auVar222._28_36_;
        auVar230._24_4_ = auVar139._24_4_ * fStack_668;
        auVar222._0_4_ = auVar139._0_4_ * (float)local_6a0._0_4_;
        auVar222._4_4_ = auVar139._4_4_ * (float)local_6a0._4_4_;
        auVar222._8_4_ = auVar139._8_4_ * fStack_698;
        auVar222._12_4_ = auVar139._12_4_ * fStack_694;
        auVar222._16_4_ = auVar139._16_4_ * fStack_690;
        auVar222._20_4_ = auVar139._20_4_ * fStack_68c;
        auVar222._28_36_ = auVar217._28_36_;
        auVar222._24_4_ = auVar139._24_4_ * fStack_688;
        auVar138 = vmulps_avx512vl(local_420,auVar139);
        local_760 = auVar239._0_32_;
        auVar129 = vfmadd231ps_avx512vl(auVar230._0_32_,auVar127,local_640);
        auVar130 = vfmadd231ps_avx512vl(auVar222._0_32_,auVar127,local_660);
        auVar138 = vfmadd231ps_avx512vl(auVar138,auVar127,local_400);
        auVar129 = vfmadd231ps_avx512vl(auVar129,auVar126,local_600);
        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar126,local_620);
        auVar137 = vfmadd231ps_avx512vl(auVar138,auVar126,local_3e0);
        auVar119 = vfmadd231ps_fma(auVar129,auVar128,local_5c0);
        auVar222 = ZEXT1664(auVar119);
        auVar120 = vfmadd231ps_fma(auVar130,auVar128,local_5e0);
        auVar217 = ZEXT1664(auVar120);
        auVar138 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar106 * 4 + lVar110);
        auVar129 = *(undefined1 (*) [32])(lVar110 + 0x2206c10 + lVar106 * 4);
        auVar124 = vfmadd231ps_avx512vl(auVar137,auVar128,local_3c0);
        auVar130 = *(undefined1 (*) [32])(lVar110 + 0x2207094 + lVar106 * 4);
        auVar137 = *(undefined1 (*) [32])(lVar110 + 0x2207518 + lVar106 * 4);
        auVar239._0_4_ = auVar137._0_4_ * (float)local_680._0_4_;
        auVar239._4_4_ = auVar137._4_4_ * (float)local_680._4_4_;
        auVar239._8_4_ = auVar137._8_4_ * fStack_678;
        auVar239._12_4_ = auVar137._12_4_ * fStack_674;
        auVar239._16_4_ = auVar137._16_4_ * fStack_670;
        auVar239._20_4_ = auVar137._20_4_ * fStack_66c;
        auVar239._28_36_ = auVar225._28_36_;
        auVar239._24_4_ = auVar137._24_4_ * fStack_668;
        auVar65._4_4_ = auVar137._4_4_ * (float)local_6a0._4_4_;
        auVar65._0_4_ = auVar137._0_4_ * (float)local_6a0._0_4_;
        auVar65._8_4_ = auVar137._8_4_ * fStack_698;
        auVar65._12_4_ = auVar137._12_4_ * fStack_694;
        auVar65._16_4_ = auVar137._16_4_ * fStack_690;
        auVar65._20_4_ = auVar137._20_4_ * fStack_68c;
        auVar65._24_4_ = auVar137._24_4_ * fStack_688;
        auVar65._28_4_ = uStack_684;
        auVar131 = vmulps_avx512vl(local_420,auVar137);
        auVar132 = vfmadd231ps_avx512vl(auVar239._0_32_,auVar130,local_640);
        auVar239 = ZEXT3264(local_760);
        auVar125 = vfmadd231ps_avx512vl(auVar65,auVar130,local_660);
        auVar131 = vfmadd231ps_avx512vl(auVar131,auVar130,local_400);
        auVar132 = vfmadd231ps_avx512vl(auVar132,auVar129,local_600);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar129,local_620);
        auVar131 = vfmadd231ps_avx512vl(auVar131,auVar129,local_3e0);
        auVar176 = vfmadd231ps_fma(auVar132,auVar138,local_5c0);
        auVar225 = ZEXT1664(auVar176);
        auVar8 = vfmadd231ps_fma(auVar125,auVar138,local_5e0);
        auVar125 = vfmadd231ps_avx512vl(auVar131,auVar138,local_3c0);
        auVar122 = vmaxps_avx512vl(auVar124,auVar125);
        auVar131 = vsubps_avx(ZEXT1632(auVar176),ZEXT1632(auVar119));
        auVar132 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar120));
        auVar123 = vmulps_avx512vl(ZEXT1632(auVar120),auVar131);
        auVar133 = vmulps_avx512vl(ZEXT1632(auVar119),auVar132);
        auVar123 = vsubps_avx512vl(auVar123,auVar133);
        auVar133 = vmulps_avx512vl(auVar132,auVar132);
        auVar133 = vfmadd231ps_avx512vl(auVar133,auVar131,auVar131);
        auVar122 = vmulps_avx512vl(auVar122,auVar122);
        auVar122 = vmulps_avx512vl(auVar122,auVar133);
        auVar123 = vmulps_avx512vl(auVar123,auVar123);
        uVar34 = vcmpps_avx512vl(auVar123,auVar122,2);
        bVar112 = (byte)uVar35 & (byte)uVar34;
        if (bVar112 != 0) {
          auVar137 = vmulps_avx512vl(local_480,auVar137);
          auVar130 = vfmadd213ps_avx512vl(auVar130,local_7e0,auVar137);
          local_780 = auVar240._0_32_;
          auVar129 = vfmadd213ps_avx512vl(auVar129,local_780,auVar130);
          auVar138 = vfmadd213ps_avx512vl(auVar138,local_760,auVar129);
          auVar139 = vmulps_avx512vl(local_480,auVar139);
          auVar127 = vfmadd213ps_avx512vl(auVar127,local_7e0,auVar139);
          auVar126 = vfmadd213ps_avx512vl(auVar126,local_780,auVar127);
          auVar129 = vfmadd213ps_avx512vl(auVar128,local_760,auVar126);
          auVar128 = *(undefined1 (*) [32])(lVar110 + 0x220557c + lVar106 * 4);
          auVar126 = *(undefined1 (*) [32])(lVar110 + 0x2205a00 + lVar106 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar110 + 0x2205e84 + lVar106 * 4);
          auVar139 = *(undefined1 (*) [32])(lVar110 + 0x2206308 + lVar106 * 4);
          auVar130 = vmulps_avx512vl(_local_680,auVar139);
          auVar137 = vmulps_avx512vl(_local_6a0,auVar139);
          auVar139 = vmulps_avx512vl(local_480,auVar139);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar127,local_640);
          auVar137 = vfmadd231ps_avx512vl(auVar137,auVar127,local_660);
          auVar118 = vfmadd231ps_fma(auVar139,auVar127,local_7e0);
          auVar127 = vfmadd231ps_avx512vl(auVar130,auVar126,local_600);
          auVar139 = vfmadd231ps_avx512vl(auVar137,auVar126,local_620);
          auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar118),local_780,auVar126);
          auVar130 = vfmadd231ps_avx512vl(auVar127,auVar128,local_5c0);
          auVar139 = vfmadd231ps_avx512vl(auVar139,auVar128,local_5e0);
          auVar137 = vfmadd231ps_avx512vl(auVar126,local_760,auVar128);
          auVar128 = *(undefined1 (*) [32])(lVar110 + 0x220799c + lVar106 * 4);
          auVar126 = *(undefined1 (*) [32])(lVar110 + 0x22082a4 + lVar106 * 4);
          auVar127 = *(undefined1 (*) [32])(lVar110 + 0x2208728 + lVar106 * 4);
          auVar122 = vmulps_avx512vl(_local_680,auVar127);
          auVar123 = vmulps_avx512vl(_local_6a0,auVar127);
          auVar127 = vmulps_avx512vl(local_480,auVar127);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar126,local_640);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar126,local_660);
          auVar127 = vfmadd231ps_avx512vl(auVar127,local_7e0,auVar126);
          auVar126 = *(undefined1 (*) [32])(lVar110 + 0x2207e20 + lVar106 * 4);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar126,local_600);
          auVar239 = ZEXT3264(local_760);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar126,local_620);
          auVar126 = vfmadd231ps_avx512vl(auVar127,local_780,auVar126);
          auVar127 = vfmadd231ps_avx512vl(auVar122,auVar128,local_5c0);
          auVar122 = vfmadd231ps_avx512vl(auVar123,auVar128,local_5e0);
          auVar126 = vfmadd231ps_avx512vl(auVar126,local_760,auVar128);
          auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar130,auVar123);
          vandps_avx512vl(auVar139,auVar123);
          auVar128 = vmaxps_avx(auVar123,auVar123);
          vandps_avx512vl(auVar137,auVar123);
          auVar128 = vmaxps_avx(auVar128,auVar123);
          auVar99._4_4_ = fStack_73c;
          auVar99._0_4_ = local_740;
          auVar99._8_4_ = fStack_738;
          auVar99._12_4_ = fStack_734;
          auVar99._16_4_ = fStack_730;
          auVar99._20_4_ = fStack_72c;
          auVar99._24_4_ = fStack_728;
          auVar99._28_4_ = fStack_724;
          uVar102 = vcmpps_avx512vl(auVar128,auVar99,1);
          bVar18 = (bool)((byte)uVar102 & 1);
          auVar152._0_4_ = (float)((uint)bVar18 * auVar131._0_4_ | (uint)!bVar18 * auVar130._0_4_);
          bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar152._4_4_ = (float)((uint)bVar18 * auVar131._4_4_ | (uint)!bVar18 * auVar130._4_4_);
          bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar152._8_4_ = (float)((uint)bVar18 * auVar131._8_4_ | (uint)!bVar18 * auVar130._8_4_);
          bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar152._12_4_ =
               (float)((uint)bVar18 * auVar131._12_4_ | (uint)!bVar18 * auVar130._12_4_);
          bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
          auVar152._16_4_ =
               (float)((uint)bVar18 * auVar131._16_4_ | (uint)!bVar18 * auVar130._16_4_);
          bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
          auVar152._20_4_ =
               (float)((uint)bVar18 * auVar131._20_4_ | (uint)!bVar18 * auVar130._20_4_);
          bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
          auVar152._24_4_ =
               (float)((uint)bVar18 * auVar131._24_4_ | (uint)!bVar18 * auVar130._24_4_);
          bVar18 = SUB81(uVar102 >> 7,0);
          auVar152._28_4_ = (uint)bVar18 * auVar131._28_4_ | (uint)!bVar18 * auVar130._28_4_;
          bVar18 = (bool)((byte)uVar102 & 1);
          auVar153._0_4_ = (float)((uint)bVar18 * auVar132._0_4_ | (uint)!bVar18 * auVar139._0_4_);
          bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar153._4_4_ = (float)((uint)bVar18 * auVar132._4_4_ | (uint)!bVar18 * auVar139._4_4_);
          bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar153._8_4_ = (float)((uint)bVar18 * auVar132._8_4_ | (uint)!bVar18 * auVar139._8_4_);
          bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar153._12_4_ =
               (float)((uint)bVar18 * auVar132._12_4_ | (uint)!bVar18 * auVar139._12_4_);
          bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
          auVar153._16_4_ =
               (float)((uint)bVar18 * auVar132._16_4_ | (uint)!bVar18 * auVar139._16_4_);
          bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
          auVar153._20_4_ =
               (float)((uint)bVar18 * auVar132._20_4_ | (uint)!bVar18 * auVar139._20_4_);
          bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
          auVar153._24_4_ =
               (float)((uint)bVar18 * auVar132._24_4_ | (uint)!bVar18 * auVar139._24_4_);
          bVar18 = SUB81(uVar102 >> 7,0);
          auVar153._28_4_ = (uint)bVar18 * auVar132._28_4_ | (uint)!bVar18 * auVar139._28_4_;
          vandps_avx512vl(auVar127,auVar123);
          vandps_avx512vl(auVar122,auVar123);
          auVar128 = vmaxps_avx(auVar153,auVar153);
          vandps_avx512vl(auVar126,auVar123);
          auVar128 = vmaxps_avx(auVar128,auVar153);
          uVar102 = vcmpps_avx512vl(auVar128,auVar99,1);
          bVar18 = (bool)((byte)uVar102 & 1);
          auVar154._0_4_ = (uint)bVar18 * auVar131._0_4_ | (uint)!bVar18 * auVar127._0_4_;
          bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar154._4_4_ = (uint)bVar18 * auVar131._4_4_ | (uint)!bVar18 * auVar127._4_4_;
          bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar154._8_4_ = (uint)bVar18 * auVar131._8_4_ | (uint)!bVar18 * auVar127._8_4_;
          bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar154._12_4_ = (uint)bVar18 * auVar131._12_4_ | (uint)!bVar18 * auVar127._12_4_;
          bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
          auVar154._16_4_ = (uint)bVar18 * auVar131._16_4_ | (uint)!bVar18 * auVar127._16_4_;
          bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
          auVar154._20_4_ = (uint)bVar18 * auVar131._20_4_ | (uint)!bVar18 * auVar127._20_4_;
          bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
          auVar154._24_4_ = (uint)bVar18 * auVar131._24_4_ | (uint)!bVar18 * auVar127._24_4_;
          bVar18 = SUB81(uVar102 >> 7,0);
          auVar154._28_4_ = (uint)bVar18 * auVar131._28_4_ | (uint)!bVar18 * auVar127._28_4_;
          bVar18 = (bool)((byte)uVar102 & 1);
          auVar155._0_4_ = (float)((uint)bVar18 * auVar132._0_4_ | (uint)!bVar18 * auVar122._0_4_);
          bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar155._4_4_ = (float)((uint)bVar18 * auVar132._4_4_ | (uint)!bVar18 * auVar122._4_4_);
          bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar155._8_4_ = (float)((uint)bVar18 * auVar132._8_4_ | (uint)!bVar18 * auVar122._8_4_);
          bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar155._12_4_ =
               (float)((uint)bVar18 * auVar132._12_4_ | (uint)!bVar18 * auVar122._12_4_);
          bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
          auVar155._16_4_ =
               (float)((uint)bVar18 * auVar132._16_4_ | (uint)!bVar18 * auVar122._16_4_);
          bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
          auVar155._20_4_ =
               (float)((uint)bVar18 * auVar132._20_4_ | (uint)!bVar18 * auVar122._20_4_);
          bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
          auVar155._24_4_ =
               (float)((uint)bVar18 * auVar132._24_4_ | (uint)!bVar18 * auVar122._24_4_);
          bVar18 = SUB81(uVar102 >> 7,0);
          auVar155._28_4_ = (uint)bVar18 * auVar132._28_4_ | (uint)!bVar18 * auVar122._28_4_;
          auVar228._8_4_ = 0x80000000;
          auVar228._0_8_ = 0x8000000080000000;
          auVar228._12_4_ = 0x80000000;
          auVar228._16_4_ = 0x80000000;
          auVar228._20_4_ = 0x80000000;
          auVar228._24_4_ = 0x80000000;
          auVar228._28_4_ = 0x80000000;
          auVar128 = vxorps_avx512vl(auVar154,auVar228);
          auVar121 = vxorps_avx512vl(auVar123._0_16_,auVar123._0_16_);
          auVar126 = vfmadd213ps_avx512vl(auVar152,auVar152,ZEXT1632(auVar121));
          auVar118 = vfmadd231ps_fma(auVar126,auVar153,auVar153);
          auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar118));
          auVar238._8_4_ = 0xbf000000;
          auVar238._0_8_ = 0xbf000000bf000000;
          auVar238._12_4_ = 0xbf000000;
          auVar238._16_4_ = 0xbf000000;
          auVar238._20_4_ = 0xbf000000;
          auVar238._24_4_ = 0xbf000000;
          auVar238._28_4_ = 0xbf000000;
          fVar190 = auVar126._0_4_;
          fVar174 = auVar126._4_4_;
          fVar187 = auVar126._8_4_;
          fVar188 = auVar126._12_4_;
          fVar197 = auVar126._16_4_;
          fVar196 = auVar126._20_4_;
          fVar211 = auVar126._24_4_;
          auVar66._4_4_ = fVar174 * fVar174 * fVar174 * auVar118._4_4_ * -0.5;
          auVar66._0_4_ = fVar190 * fVar190 * fVar190 * auVar118._0_4_ * -0.5;
          auVar66._8_4_ = fVar187 * fVar187 * fVar187 * auVar118._8_4_ * -0.5;
          auVar66._12_4_ = fVar188 * fVar188 * fVar188 * auVar118._12_4_ * -0.5;
          auVar66._16_4_ = fVar197 * fVar197 * fVar197 * -0.0;
          auVar66._20_4_ = fVar196 * fVar196 * fVar196 * -0.0;
          auVar66._24_4_ = fVar211 * fVar211 * fVar211 * -0.0;
          auVar66._28_4_ = auVar153._28_4_;
          auVar127 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar126 = vfmadd231ps_avx512vl(auVar66,auVar127,auVar126);
          auVar67._4_4_ = auVar153._4_4_ * auVar126._4_4_;
          auVar67._0_4_ = auVar153._0_4_ * auVar126._0_4_;
          auVar67._8_4_ = auVar153._8_4_ * auVar126._8_4_;
          auVar67._12_4_ = auVar153._12_4_ * auVar126._12_4_;
          auVar67._16_4_ = auVar153._16_4_ * auVar126._16_4_;
          auVar67._20_4_ = auVar153._20_4_ * auVar126._20_4_;
          auVar67._24_4_ = auVar153._24_4_ * auVar126._24_4_;
          auVar67._28_4_ = 0;
          auVar68._4_4_ = auVar126._4_4_ * -auVar152._4_4_;
          auVar68._0_4_ = auVar126._0_4_ * -auVar152._0_4_;
          auVar68._8_4_ = auVar126._8_4_ * -auVar152._8_4_;
          auVar68._12_4_ = auVar126._12_4_ * -auVar152._12_4_;
          auVar68._16_4_ = auVar126._16_4_ * -auVar152._16_4_;
          auVar68._20_4_ = auVar126._20_4_ * -auVar152._20_4_;
          auVar68._24_4_ = auVar126._24_4_ * -auVar152._24_4_;
          auVar68._28_4_ = auVar153._28_4_;
          auVar139 = vmulps_avx512vl(auVar126,ZEXT1632(auVar121));
          auVar137 = ZEXT1632(auVar121);
          auVar126 = vfmadd213ps_avx512vl(auVar154,auVar154,auVar137);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar155,auVar155);
          auVar130 = vrsqrt14ps_avx512vl(auVar126);
          auVar126 = vmulps_avx512vl(auVar126,auVar238);
          fVar190 = auVar130._0_4_;
          fVar174 = auVar130._4_4_;
          fVar187 = auVar130._8_4_;
          fVar188 = auVar130._12_4_;
          fVar197 = auVar130._16_4_;
          fVar196 = auVar130._20_4_;
          fVar211 = auVar130._24_4_;
          auVar69._4_4_ = fVar174 * fVar174 * fVar174 * auVar126._4_4_;
          auVar69._0_4_ = fVar190 * fVar190 * fVar190 * auVar126._0_4_;
          auVar69._8_4_ = fVar187 * fVar187 * fVar187 * auVar126._8_4_;
          auVar69._12_4_ = fVar188 * fVar188 * fVar188 * auVar126._12_4_;
          auVar69._16_4_ = fVar197 * fVar197 * fVar197 * auVar126._16_4_;
          auVar69._20_4_ = fVar196 * fVar196 * fVar196 * auVar126._20_4_;
          auVar69._24_4_ = fVar211 * fVar211 * fVar211 * auVar126._24_4_;
          auVar69._28_4_ = auVar126._28_4_;
          auVar126 = vfmadd231ps_avx512vl(auVar69,auVar127,auVar130);
          auVar70._4_4_ = auVar155._4_4_ * auVar126._4_4_;
          auVar70._0_4_ = auVar155._0_4_ * auVar126._0_4_;
          auVar70._8_4_ = auVar155._8_4_ * auVar126._8_4_;
          auVar70._12_4_ = auVar155._12_4_ * auVar126._12_4_;
          auVar70._16_4_ = auVar155._16_4_ * auVar126._16_4_;
          auVar70._20_4_ = auVar155._20_4_ * auVar126._20_4_;
          auVar70._24_4_ = auVar155._24_4_ * auVar126._24_4_;
          auVar70._28_4_ = auVar130._28_4_;
          auVar71._4_4_ = auVar126._4_4_ * auVar128._4_4_;
          auVar71._0_4_ = auVar126._0_4_ * auVar128._0_4_;
          auVar71._8_4_ = auVar126._8_4_ * auVar128._8_4_;
          auVar71._12_4_ = auVar126._12_4_ * auVar128._12_4_;
          auVar71._16_4_ = auVar126._16_4_ * auVar128._16_4_;
          auVar71._20_4_ = auVar126._20_4_ * auVar128._20_4_;
          auVar71._24_4_ = auVar126._24_4_ * auVar128._24_4_;
          auVar71._28_4_ = auVar128._28_4_;
          auVar128 = vmulps_avx512vl(auVar126,auVar137);
          auVar118 = vfmadd213ps_fma(auVar67,auVar124,ZEXT1632(auVar119));
          auVar206 = vfmadd213ps_fma(auVar68,auVar124,ZEXT1632(auVar120));
          auVar127 = vfmadd213ps_avx512vl(auVar139,auVar124,auVar129);
          auVar130 = vfmadd213ps_avx512vl(auVar70,auVar125,ZEXT1632(auVar176));
          auVar114 = vfnmadd213ps_fma(auVar67,auVar124,ZEXT1632(auVar119));
          auVar119 = vfmadd213ps_fma(auVar71,auVar125,ZEXT1632(auVar8));
          auVar226 = vfnmadd213ps_fma(auVar68,auVar124,ZEXT1632(auVar120));
          auVar120 = vfmadd213ps_fma(auVar128,auVar125,auVar138);
          auVar38 = vfnmadd231ps_fma(auVar129,auVar124,auVar139);
          auVar198 = vfnmadd213ps_fma(auVar70,auVar125,ZEXT1632(auVar176));
          auVar115 = vfnmadd213ps_fma(auVar71,auVar125,ZEXT1632(auVar8));
          auVar116 = vfnmadd231ps_fma(auVar138,auVar125,auVar128);
          auVar138 = vsubps_avx512vl(auVar130,ZEXT1632(auVar114));
          auVar128 = vsubps_avx(ZEXT1632(auVar119),ZEXT1632(auVar226));
          auVar126 = vsubps_avx(ZEXT1632(auVar120),ZEXT1632(auVar38));
          auVar72._4_4_ = auVar128._4_4_ * auVar38._4_4_;
          auVar72._0_4_ = auVar128._0_4_ * auVar38._0_4_;
          auVar72._8_4_ = auVar128._8_4_ * auVar38._8_4_;
          auVar72._12_4_ = auVar128._12_4_ * auVar38._12_4_;
          auVar72._16_4_ = auVar128._16_4_ * 0.0;
          auVar72._20_4_ = auVar128._20_4_ * 0.0;
          auVar72._24_4_ = auVar128._24_4_ * 0.0;
          auVar72._28_4_ = auVar139._28_4_;
          auVar176 = vfmsub231ps_fma(auVar72,ZEXT1632(auVar226),auVar126);
          auVar73._4_4_ = auVar126._4_4_ * auVar114._4_4_;
          auVar73._0_4_ = auVar126._0_4_ * auVar114._0_4_;
          auVar73._8_4_ = auVar126._8_4_ * auVar114._8_4_;
          auVar73._12_4_ = auVar126._12_4_ * auVar114._12_4_;
          auVar73._16_4_ = auVar126._16_4_ * 0.0;
          auVar73._20_4_ = auVar126._20_4_ * 0.0;
          auVar73._24_4_ = auVar126._24_4_ * 0.0;
          auVar73._28_4_ = auVar126._28_4_;
          auVar8 = vfmsub231ps_fma(auVar73,ZEXT1632(auVar38),auVar138);
          auVar74._4_4_ = auVar226._4_4_ * auVar138._4_4_;
          auVar74._0_4_ = auVar226._0_4_ * auVar138._0_4_;
          auVar74._8_4_ = auVar226._8_4_ * auVar138._8_4_;
          auVar74._12_4_ = auVar226._12_4_ * auVar138._12_4_;
          auVar74._16_4_ = auVar138._16_4_ * 0.0;
          auVar74._20_4_ = auVar138._20_4_ * 0.0;
          auVar74._24_4_ = auVar138._24_4_ * 0.0;
          auVar74._28_4_ = auVar138._28_4_;
          auVar117 = vfmsub231ps_fma(auVar74,ZEXT1632(auVar114),auVar128);
          auVar128 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),auVar137,ZEXT1632(auVar8));
          auVar128 = vfmadd231ps_avx512vl(auVar128,auVar137,ZEXT1632(auVar176));
          auVar123 = ZEXT1632(auVar121);
          uVar102 = vcmpps_avx512vl(auVar128,auVar123,2);
          bVar101 = (byte)uVar102;
          fVar166 = (float)((uint)(bVar101 & 1) * auVar118._0_4_ |
                           (uint)!(bool)(bVar101 & 1) * auVar198._0_4_);
          bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
          fVar168 = (float)((uint)bVar18 * auVar118._4_4_ | (uint)!bVar18 * auVar198._4_4_);
          bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
          fVar170 = (float)((uint)bVar18 * auVar118._8_4_ | (uint)!bVar18 * auVar198._8_4_);
          bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
          fVar172 = (float)((uint)bVar18 * auVar118._12_4_ | (uint)!bVar18 * auVar198._12_4_);
          auVar137 = ZEXT1632(CONCAT412(fVar172,CONCAT48(fVar170,CONCAT44(fVar168,fVar166))));
          fVar167 = (float)((uint)(bVar101 & 1) * auVar206._0_4_ |
                           (uint)!(bool)(bVar101 & 1) * auVar115._0_4_);
          bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
          fVar169 = (float)((uint)bVar18 * auVar206._4_4_ | (uint)!bVar18 * auVar115._4_4_);
          bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
          fVar171 = (float)((uint)bVar18 * auVar206._8_4_ | (uint)!bVar18 * auVar115._8_4_);
          bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
          fVar173 = (float)((uint)bVar18 * auVar206._12_4_ | (uint)!bVar18 * auVar115._12_4_);
          auVar131 = ZEXT1632(CONCAT412(fVar173,CONCAT48(fVar171,CONCAT44(fVar169,fVar167))));
          auVar156._0_4_ =
               (float)((uint)(bVar101 & 1) * auVar127._0_4_ |
                      (uint)!(bool)(bVar101 & 1) * auVar116._0_4_);
          bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar156._4_4_ = (float)((uint)bVar18 * auVar127._4_4_ | (uint)!bVar18 * auVar116._4_4_);
          bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar156._8_4_ = (float)((uint)bVar18 * auVar127._8_4_ | (uint)!bVar18 * auVar116._8_4_);
          bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar156._12_4_ =
               (float)((uint)bVar18 * auVar127._12_4_ | (uint)!bVar18 * auVar116._12_4_);
          fVar190 = (float)((uint)((byte)(uVar102 >> 4) & 1) * auVar127._16_4_);
          auVar156._16_4_ = fVar190;
          fVar174 = (float)((uint)((byte)(uVar102 >> 5) & 1) * auVar127._20_4_);
          auVar156._20_4_ = fVar174;
          fVar187 = (float)((uint)((byte)(uVar102 >> 6) & 1) * auVar127._24_4_);
          auVar156._24_4_ = fVar187;
          iVar1 = (uint)(byte)(uVar102 >> 7) * auVar127._28_4_;
          auVar156._28_4_ = iVar1;
          auVar128 = vblendmps_avx512vl(ZEXT1632(auVar114),auVar130);
          auVar157._0_4_ =
               (uint)(bVar101 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar101 & 1) * auVar176._0_4_;
          bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar157._4_4_ = (uint)bVar18 * auVar128._4_4_ | (uint)!bVar18 * auVar176._4_4_;
          bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar157._8_4_ = (uint)bVar18 * auVar128._8_4_ | (uint)!bVar18 * auVar176._8_4_;
          bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar157._12_4_ = (uint)bVar18 * auVar128._12_4_ | (uint)!bVar18 * auVar176._12_4_;
          auVar157._16_4_ = (uint)((byte)(uVar102 >> 4) & 1) * auVar128._16_4_;
          auVar157._20_4_ = (uint)((byte)(uVar102 >> 5) & 1) * auVar128._20_4_;
          auVar157._24_4_ = (uint)((byte)(uVar102 >> 6) & 1) * auVar128._24_4_;
          auVar157._28_4_ = (uint)(byte)(uVar102 >> 7) * auVar128._28_4_;
          auVar128 = vblendmps_avx512vl(ZEXT1632(auVar226),ZEXT1632(auVar119));
          auVar158._0_4_ =
               (float)((uint)(bVar101 & 1) * auVar128._0_4_ |
                      (uint)!(bool)(bVar101 & 1) * auVar118._0_4_);
          bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar158._4_4_ = (float)((uint)bVar18 * auVar128._4_4_ | (uint)!bVar18 * auVar118._4_4_);
          bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar158._8_4_ = (float)((uint)bVar18 * auVar128._8_4_ | (uint)!bVar18 * auVar118._8_4_);
          bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar158._12_4_ =
               (float)((uint)bVar18 * auVar128._12_4_ | (uint)!bVar18 * auVar118._12_4_);
          fVar197 = (float)((uint)((byte)(uVar102 >> 4) & 1) * auVar128._16_4_);
          auVar158._16_4_ = fVar197;
          fVar188 = (float)((uint)((byte)(uVar102 >> 5) & 1) * auVar128._20_4_);
          auVar158._20_4_ = fVar188;
          fVar196 = (float)((uint)((byte)(uVar102 >> 6) & 1) * auVar128._24_4_);
          auVar158._24_4_ = fVar196;
          auVar158._28_4_ = (uint)(byte)(uVar102 >> 7) * auVar128._28_4_;
          auVar128 = vblendmps_avx512vl(ZEXT1632(auVar38),ZEXT1632(auVar120));
          auVar159._0_4_ =
               (float)((uint)(bVar101 & 1) * auVar128._0_4_ |
                      (uint)!(bool)(bVar101 & 1) * auVar206._0_4_);
          bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar159._4_4_ = (float)((uint)bVar18 * auVar128._4_4_ | (uint)!bVar18 * auVar206._4_4_);
          bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar159._8_4_ = (float)((uint)bVar18 * auVar128._8_4_ | (uint)!bVar18 * auVar206._8_4_);
          bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar159._12_4_ =
               (float)((uint)bVar18 * auVar128._12_4_ | (uint)!bVar18 * auVar206._12_4_);
          fVar195 = (float)((uint)((byte)(uVar102 >> 4) & 1) * auVar128._16_4_);
          auVar159._16_4_ = fVar195;
          fVar211 = (float)((uint)((byte)(uVar102 >> 5) & 1) * auVar128._20_4_);
          auVar159._20_4_ = fVar211;
          fVar113 = (float)((uint)((byte)(uVar102 >> 6) & 1) * auVar128._24_4_);
          auVar159._24_4_ = fVar113;
          iVar2 = (uint)(byte)(uVar102 >> 7) * auVar128._28_4_;
          auVar159._28_4_ = iVar2;
          auVar160._0_4_ =
               (uint)(bVar101 & 1) * (int)auVar114._0_4_ |
               (uint)!(bool)(bVar101 & 1) * auVar130._0_4_;
          bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar160._4_4_ = (uint)bVar18 * (int)auVar114._4_4_ | (uint)!bVar18 * auVar130._4_4_;
          bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar160._8_4_ = (uint)bVar18 * (int)auVar114._8_4_ | (uint)!bVar18 * auVar130._8_4_;
          bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar160._12_4_ = (uint)bVar18 * (int)auVar114._12_4_ | (uint)!bVar18 * auVar130._12_4_;
          auVar160._16_4_ = (uint)!(bool)((byte)(uVar102 >> 4) & 1) * auVar130._16_4_;
          auVar160._20_4_ = (uint)!(bool)((byte)(uVar102 >> 5) & 1) * auVar130._20_4_;
          auVar160._24_4_ = (uint)!(bool)((byte)(uVar102 >> 6) & 1) * auVar130._24_4_;
          auVar160._28_4_ = (uint)!SUB81(uVar102 >> 7,0) * auVar130._28_4_;
          bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar102 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar102 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar102 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar102 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar130 = vsubps_avx512vl(auVar160,auVar137);
          auVar126 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar226._12_4_ |
                                                   (uint)!bVar22 * auVar119._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar226._8_4_ |
                                                            (uint)!bVar20 * auVar119._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar226._4_4_ |
                                                                     (uint)!bVar18 * auVar119._4_4_,
                                                                     (uint)(bVar101 & 1) *
                                                                     (int)auVar226._0_4_ |
                                                                     (uint)!(bool)(bVar101 & 1) *
                                                                     auVar119._0_4_)))),auVar131);
          auVar222 = ZEXT3264(auVar126);
          auVar127 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar38._12_4_ |
                                                   (uint)!bVar23 * auVar120._12_4_,
                                                   CONCAT48((uint)bVar21 * (int)auVar38._8_4_ |
                                                            (uint)!bVar21 * auVar120._8_4_,
                                                            CONCAT44((uint)bVar19 *
                                                                     (int)auVar38._4_4_ |
                                                                     (uint)!bVar19 * auVar120._4_4_,
                                                                     (uint)(bVar101 & 1) *
                                                                     (int)auVar38._0_4_ |
                                                                     (uint)!(bool)(bVar101 & 1) *
                                                                     auVar120._0_4_)))),auVar156);
          auVar139 = vsubps_avx(auVar137,auVar157);
          auVar225 = ZEXT3264(auVar139);
          auVar138 = vsubps_avx(auVar131,auVar158);
          auVar129 = vsubps_avx(auVar156,auVar159);
          auVar75._4_4_ = auVar127._4_4_ * fVar168;
          auVar75._0_4_ = auVar127._0_4_ * fVar166;
          auVar75._8_4_ = auVar127._8_4_ * fVar170;
          auVar75._12_4_ = auVar127._12_4_ * fVar172;
          auVar75._16_4_ = auVar127._16_4_ * 0.0;
          auVar75._20_4_ = auVar127._20_4_ * 0.0;
          auVar75._24_4_ = auVar127._24_4_ * 0.0;
          auVar75._28_4_ = 0;
          auVar119 = vfmsub231ps_fma(auVar75,auVar156,auVar130);
          auVar209._0_4_ = fVar167 * auVar130._0_4_;
          auVar209._4_4_ = fVar169 * auVar130._4_4_;
          auVar209._8_4_ = fVar171 * auVar130._8_4_;
          auVar209._12_4_ = fVar173 * auVar130._12_4_;
          auVar209._16_4_ = auVar130._16_4_ * 0.0;
          auVar209._20_4_ = auVar130._20_4_ * 0.0;
          auVar209._24_4_ = auVar130._24_4_ * 0.0;
          auVar209._28_4_ = 0;
          auVar120 = vfmsub231ps_fma(auVar209,auVar137,auVar126);
          auVar128 = vfmadd231ps_avx512vl(ZEXT1632(auVar120),auVar123,ZEXT1632(auVar119));
          auVar215._0_4_ = auVar126._0_4_ * auVar156._0_4_;
          auVar215._4_4_ = auVar126._4_4_ * auVar156._4_4_;
          auVar215._8_4_ = auVar126._8_4_ * auVar156._8_4_;
          auVar215._12_4_ = auVar126._12_4_ * auVar156._12_4_;
          auVar215._16_4_ = auVar126._16_4_ * fVar190;
          auVar215._20_4_ = auVar126._20_4_ * fVar174;
          auVar215._24_4_ = auVar126._24_4_ * fVar187;
          auVar215._28_4_ = 0;
          auVar119 = vfmsub231ps_fma(auVar215,auVar131,auVar127);
          auVar132 = vfmadd231ps_avx512vl(auVar128,auVar123,ZEXT1632(auVar119));
          auVar128 = vmulps_avx512vl(auVar129,auVar157);
          auVar128 = vfmsub231ps_avx512vl(auVar128,auVar139,auVar159);
          auVar76._4_4_ = auVar138._4_4_ * auVar159._4_4_;
          auVar76._0_4_ = auVar138._0_4_ * auVar159._0_4_;
          auVar76._8_4_ = auVar138._8_4_ * auVar159._8_4_;
          auVar76._12_4_ = auVar138._12_4_ * auVar159._12_4_;
          auVar76._16_4_ = auVar138._16_4_ * fVar195;
          auVar76._20_4_ = auVar138._20_4_ * fVar211;
          auVar76._24_4_ = auVar138._24_4_ * fVar113;
          auVar76._28_4_ = iVar2;
          auVar119 = vfmsub231ps_fma(auVar76,auVar158,auVar129);
          auVar216._0_4_ = auVar158._0_4_ * auVar139._0_4_;
          auVar216._4_4_ = auVar158._4_4_ * auVar139._4_4_;
          auVar216._8_4_ = auVar158._8_4_ * auVar139._8_4_;
          auVar216._12_4_ = auVar158._12_4_ * auVar139._12_4_;
          auVar216._16_4_ = fVar197 * auVar139._16_4_;
          auVar216._20_4_ = fVar188 * auVar139._20_4_;
          auVar216._24_4_ = fVar196 * auVar139._24_4_;
          auVar216._28_4_ = 0;
          auVar120 = vfmsub231ps_fma(auVar216,auVar138,auVar157);
          auVar128 = vfmadd231ps_avx512vl(ZEXT1632(auVar120),auVar123,auVar128);
          auVar122 = vfmadd231ps_avx512vl(auVar128,auVar123,ZEXT1632(auVar119));
          auVar217 = ZEXT3264(auVar122);
          auVar128 = vmaxps_avx(auVar132,auVar122);
          uVar34 = vcmpps_avx512vl(auVar128,auVar123,2);
          bVar112 = bVar112 & (byte)uVar34;
          if (bVar112 != 0) {
            auVar77._4_4_ = auVar129._4_4_ * auVar126._4_4_;
            auVar77._0_4_ = auVar129._0_4_ * auVar126._0_4_;
            auVar77._8_4_ = auVar129._8_4_ * auVar126._8_4_;
            auVar77._12_4_ = auVar129._12_4_ * auVar126._12_4_;
            auVar77._16_4_ = auVar129._16_4_ * auVar126._16_4_;
            auVar77._20_4_ = auVar129._20_4_ * auVar126._20_4_;
            auVar77._24_4_ = auVar129._24_4_ * auVar126._24_4_;
            auVar77._28_4_ = auVar128._28_4_;
            auVar8 = vfmsub231ps_fma(auVar77,auVar138,auVar127);
            auVar78._4_4_ = auVar127._4_4_ * auVar139._4_4_;
            auVar78._0_4_ = auVar127._0_4_ * auVar139._0_4_;
            auVar78._8_4_ = auVar127._8_4_ * auVar139._8_4_;
            auVar78._12_4_ = auVar127._12_4_ * auVar139._12_4_;
            auVar78._16_4_ = auVar127._16_4_ * auVar139._16_4_;
            auVar78._20_4_ = auVar127._20_4_ * auVar139._20_4_;
            auVar78._24_4_ = auVar127._24_4_ * auVar139._24_4_;
            auVar78._28_4_ = auVar127._28_4_;
            auVar176 = vfmsub231ps_fma(auVar78,auVar130,auVar129);
            auVar79._4_4_ = auVar138._4_4_ * auVar130._4_4_;
            auVar79._0_4_ = auVar138._0_4_ * auVar130._0_4_;
            auVar79._8_4_ = auVar138._8_4_ * auVar130._8_4_;
            auVar79._12_4_ = auVar138._12_4_ * auVar130._12_4_;
            auVar79._16_4_ = auVar138._16_4_ * auVar130._16_4_;
            auVar79._20_4_ = auVar138._20_4_ * auVar130._20_4_;
            auVar79._24_4_ = auVar138._24_4_ * auVar130._24_4_;
            auVar79._28_4_ = auVar138._28_4_;
            auVar118 = vfmsub231ps_fma(auVar79,auVar139,auVar126);
            auVar119 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar176),ZEXT1632(auVar118));
            auVar120 = vfmadd231ps_fma(ZEXT1632(auVar119),ZEXT1632(auVar8),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar128 = vrcp14ps_avx512vl(ZEXT1632(auVar120));
            auVar225 = ZEXT3264(auVar128);
            auVar44._8_4_ = 0x3f800000;
            auVar44._0_8_ = 0x3f8000003f800000;
            auVar44._12_4_ = 0x3f800000;
            auVar44._16_4_ = 0x3f800000;
            auVar44._20_4_ = 0x3f800000;
            auVar44._24_4_ = 0x3f800000;
            auVar44._28_4_ = 0x3f800000;
            auVar126 = vfnmadd213ps_avx512vl(auVar128,ZEXT1632(auVar120),auVar44);
            auVar119 = vfmadd132ps_fma(auVar126,auVar128,auVar128);
            auVar222 = ZEXT1664(auVar119);
            auVar80._4_4_ = auVar118._4_4_ * auVar156._4_4_;
            auVar80._0_4_ = auVar118._0_4_ * auVar156._0_4_;
            auVar80._8_4_ = auVar118._8_4_ * auVar156._8_4_;
            auVar80._12_4_ = auVar118._12_4_ * auVar156._12_4_;
            auVar80._16_4_ = fVar190 * 0.0;
            auVar80._20_4_ = fVar174 * 0.0;
            auVar80._24_4_ = fVar187 * 0.0;
            auVar80._28_4_ = iVar1;
            auVar176 = vfmadd231ps_fma(auVar80,auVar131,ZEXT1632(auVar176));
            auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar137,ZEXT1632(auVar8));
            fVar190 = auVar119._0_4_;
            fVar174 = auVar119._4_4_;
            fVar187 = auVar119._8_4_;
            fVar188 = auVar119._12_4_;
            local_560 = ZEXT1632(CONCAT412(auVar176._12_4_ * fVar188,
                                           CONCAT48(auVar176._8_4_ * fVar187,
                                                    CONCAT44(auVar176._4_4_ * fVar174,
                                                             auVar176._0_4_ * fVar190))));
            auVar230 = ZEXT3264(local_560);
            auVar100._4_4_ = uStack_71c;
            auVar100._0_4_ = local_720;
            auVar100._8_4_ = uStack_718;
            auVar100._12_4_ = uStack_714;
            auVar100._16_4_ = uStack_710;
            auVar100._20_4_ = uStack_70c;
            auVar100._24_4_ = uStack_708;
            auVar100._28_4_ = uStack_704;
            uVar34 = vcmpps_avx512vl(local_560,auVar100,0xd);
            uVar175 = *(undefined4 *)(ray + sVar111 * 4 + 0x200);
            auVar45._4_4_ = uVar175;
            auVar45._0_4_ = uVar175;
            auVar45._8_4_ = uVar175;
            auVar45._12_4_ = uVar175;
            auVar45._16_4_ = uVar175;
            auVar45._20_4_ = uVar175;
            auVar45._24_4_ = uVar175;
            auVar45._28_4_ = uVar175;
            uVar35 = vcmpps_avx512vl(local_560,auVar45,2);
            bVar112 = (byte)uVar34 & (byte)uVar35 & bVar112;
            if (bVar112 != 0) {
              uVar109 = vcmpps_avx512vl(ZEXT1632(auVar120),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar109 = bVar112 & uVar109;
              if ((char)uVar109 != '\0') {
                fVar197 = auVar132._0_4_ * fVar190;
                fVar196 = auVar132._4_4_ * fVar174;
                auVar81._4_4_ = fVar196;
                auVar81._0_4_ = fVar197;
                fVar211 = auVar132._8_4_ * fVar187;
                auVar81._8_4_ = fVar211;
                fVar113 = auVar132._12_4_ * fVar188;
                auVar81._12_4_ = fVar113;
                fVar195 = auVar132._16_4_ * 0.0;
                auVar81._16_4_ = fVar195;
                fVar166 = auVar132._20_4_ * 0.0;
                auVar81._20_4_ = fVar166;
                fVar167 = auVar132._24_4_ * 0.0;
                auVar81._24_4_ = fVar167;
                auVar81._28_4_ = auVar132._28_4_;
                auVar194._8_4_ = 0x3f800000;
                auVar194._0_8_ = 0x3f8000003f800000;
                auVar194._12_4_ = 0x3f800000;
                auVar194._16_4_ = 0x3f800000;
                auVar194._20_4_ = 0x3f800000;
                auVar194._24_4_ = 0x3f800000;
                auVar194._28_4_ = 0x3f800000;
                auVar128 = vsubps_avx(auVar194,auVar81);
                local_5a0._0_4_ =
                     (float)((uint)(bVar101 & 1) * (int)fVar197 |
                            (uint)!(bool)(bVar101 & 1) * auVar128._0_4_);
                bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
                local_5a0._4_4_ =
                     (float)((uint)bVar18 * (int)fVar196 | (uint)!bVar18 * auVar128._4_4_);
                bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
                local_5a0._8_4_ =
                     (float)((uint)bVar18 * (int)fVar211 | (uint)!bVar18 * auVar128._8_4_);
                bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
                local_5a0._12_4_ =
                     (float)((uint)bVar18 * (int)fVar113 | (uint)!bVar18 * auVar128._12_4_);
                bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
                local_5a0._16_4_ =
                     (float)((uint)bVar18 * (int)fVar195 | (uint)!bVar18 * auVar128._16_4_);
                bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
                local_5a0._20_4_ =
                     (float)((uint)bVar18 * (int)fVar166 | (uint)!bVar18 * auVar128._20_4_);
                bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
                local_5a0._24_4_ =
                     (float)((uint)bVar18 * (int)fVar167 | (uint)!bVar18 * auVar128._24_4_);
                bVar18 = SUB81(uVar102 >> 7,0);
                local_5a0._28_4_ =
                     (float)((uint)bVar18 * auVar132._28_4_ | (uint)!bVar18 * auVar128._28_4_);
                auVar128 = vsubps_avx(auVar125,auVar124);
                auVar119 = vfmadd213ps_fma(auVar128,local_5a0,auVar124);
                uVar175 = *(undefined4 *)((long)pre->ray_space + sVar111 * 4 + -0x40);
                auVar46._4_4_ = uVar175;
                auVar46._0_4_ = uVar175;
                auVar46._8_4_ = uVar175;
                auVar46._12_4_ = uVar175;
                auVar46._16_4_ = uVar175;
                auVar46._20_4_ = uVar175;
                auVar46._24_4_ = uVar175;
                auVar46._28_4_ = uVar175;
                auVar128 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar119._12_4_ + auVar119._12_4_,
                                                              CONCAT48(auVar119._8_4_ +
                                                                       auVar119._8_4_,
                                                                       CONCAT44(auVar119._4_4_ +
                                                                                auVar119._4_4_,
                                                                                auVar119._0_4_ +
                                                                                auVar119._0_4_)))),
                                           auVar46);
                uVar36 = vcmpps_avx512vl(local_560,auVar128,6);
                uVar109 = uVar109 & uVar36;
                bVar112 = (byte)uVar109;
                if (bVar112 != 0) {
                  auVar189._0_4_ = auVar122._0_4_ * fVar190;
                  auVar189._4_4_ = auVar122._4_4_ * fVar174;
                  auVar189._8_4_ = auVar122._8_4_ * fVar187;
                  auVar189._12_4_ = auVar122._12_4_ * fVar188;
                  auVar189._16_4_ = auVar122._16_4_ * 0.0;
                  auVar189._20_4_ = auVar122._20_4_ * 0.0;
                  auVar189._24_4_ = auVar122._24_4_ * 0.0;
                  auVar189._28_4_ = 0;
                  auVar210._8_4_ = 0x3f800000;
                  auVar210._0_8_ = 0x3f8000003f800000;
                  auVar210._12_4_ = 0x3f800000;
                  auVar210._16_4_ = 0x3f800000;
                  auVar210._20_4_ = 0x3f800000;
                  auVar210._24_4_ = 0x3f800000;
                  auVar210._28_4_ = 0x3f800000;
                  auVar128 = vsubps_avx(auVar210,auVar189);
                  auVar161._0_4_ =
                       (uint)(bVar101 & 1) * (int)auVar189._0_4_ |
                       (uint)!(bool)(bVar101 & 1) * auVar128._0_4_;
                  bVar18 = (bool)((byte)(uVar102 >> 1) & 1);
                  auVar161._4_4_ =
                       (uint)bVar18 * (int)auVar189._4_4_ | (uint)!bVar18 * auVar128._4_4_;
                  bVar18 = (bool)((byte)(uVar102 >> 2) & 1);
                  auVar161._8_4_ =
                       (uint)bVar18 * (int)auVar189._8_4_ | (uint)!bVar18 * auVar128._8_4_;
                  bVar18 = (bool)((byte)(uVar102 >> 3) & 1);
                  auVar161._12_4_ =
                       (uint)bVar18 * (int)auVar189._12_4_ | (uint)!bVar18 * auVar128._12_4_;
                  bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
                  auVar161._16_4_ =
                       (uint)bVar18 * (int)auVar189._16_4_ | (uint)!bVar18 * auVar128._16_4_;
                  bVar18 = (bool)((byte)(uVar102 >> 5) & 1);
                  auVar161._20_4_ =
                       (uint)bVar18 * (int)auVar189._20_4_ | (uint)!bVar18 * auVar128._20_4_;
                  bVar18 = (bool)((byte)(uVar102 >> 6) & 1);
                  auVar161._24_4_ =
                       (uint)bVar18 * (int)auVar189._24_4_ | (uint)!bVar18 * auVar128._24_4_;
                  auVar161._28_4_ = (uint)!SUB81(uVar102 >> 7,0) * auVar128._28_4_;
                  auVar47._8_4_ = 0x40000000;
                  auVar47._0_8_ = 0x4000000040000000;
                  auVar47._12_4_ = 0x40000000;
                  auVar47._16_4_ = 0x40000000;
                  auVar47._20_4_ = 0x40000000;
                  auVar47._24_4_ = 0x40000000;
                  auVar47._28_4_ = 0x40000000;
                  local_580 = vfmsub132ps_avx512vl(auVar161,auVar210,auVar47);
                  local_540 = (undefined4)lVar106;
                  pGVar107 = (context->scene->geometries).items[uVar13].ptr;
                  if ((pGVar107->mask & *(uint *)(ray + sVar111 * 4 + 0x240)) != 0) {
                    auVar119 = vcvtsi2ss_avx512f(auVar121,local_540);
                    fVar190 = auVar119._0_4_;
                    local_4e0[0] = (fVar190 + local_5a0._0_4_ + 0.0) * local_440;
                    local_4e0[1] = (fVar190 + local_5a0._4_4_ + 1.0) * fStack_43c;
                    local_4e0[2] = (fVar190 + local_5a0._8_4_ + 2.0) * fStack_438;
                    local_4e0[3] = (fVar190 + local_5a0._12_4_ + 3.0) * fStack_434;
                    fStack_4d0 = (fVar190 + local_5a0._16_4_ + 4.0) * fStack_430;
                    fStack_4cc = (fVar190 + local_5a0._20_4_ + 5.0) * fStack_42c;
                    fStack_4c8 = (fVar190 + local_5a0._24_4_ + 6.0) * fStack_428;
                    fStack_4c4 = fVar190 + local_5a0._28_4_ + 7.0;
                    local_4c0 = local_580;
                    local_4a0 = local_560;
                    auVar181._8_4_ = 0x7f800000;
                    auVar181._0_8_ = 0x7f8000007f800000;
                    auVar181._12_4_ = 0x7f800000;
                    auVar181._16_4_ = 0x7f800000;
                    auVar181._20_4_ = 0x7f800000;
                    auVar181._24_4_ = 0x7f800000;
                    auVar181._28_4_ = 0x7f800000;
                    auVar128 = vblendmps_avx512vl(auVar181,local_560);
                    auVar162._0_4_ =
                         (uint)(bVar112 & 1) * auVar128._0_4_ |
                         (uint)!(bool)(bVar112 & 1) * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar109 >> 1) & 1);
                    auVar162._4_4_ = (uint)bVar18 * auVar128._4_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar109 >> 2) & 1);
                    auVar162._8_4_ = (uint)bVar18 * auVar128._8_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar109 >> 3) & 1);
                    auVar162._12_4_ = (uint)bVar18 * auVar128._12_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar109 >> 4) & 1);
                    auVar162._16_4_ = (uint)bVar18 * auVar128._16_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar109 >> 5) & 1);
                    auVar162._20_4_ = (uint)bVar18 * auVar128._20_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar109 >> 6) & 1);
                    auVar162._24_4_ = (uint)bVar18 * auVar128._24_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = SUB81(uVar109 >> 7,0);
                    auVar162._28_4_ = (uint)bVar18 * auVar128._28_4_ | (uint)!bVar18 * 0x7f800000;
                    auVar128 = vshufps_avx(auVar162,auVar162,0xb1);
                    auVar128 = vminps_avx(auVar162,auVar128);
                    auVar126 = vshufpd_avx(auVar128,auVar128,5);
                    auVar128 = vminps_avx(auVar128,auVar126);
                    auVar126 = vpermpd_avx2(auVar128,0x4e);
                    auVar128 = vminps_avx(auVar128,auVar126);
                    uVar34 = vcmpps_avx512vl(auVar162,auVar128,0);
                    uVar103 = (uint)uVar109;
                    if ((bVar112 & (byte)uVar34) != 0) {
                      uVar103 = (uint)(bVar112 & (byte)uVar34);
                    }
                    uVar104 = 0;
                    for (; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x80000000) {
                      uVar104 = uVar104 + 1;
                    }
                    uVar102 = (ulong)uVar104;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar107->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_460 = vmovdqa64_avx512vl(auVar186._0_32_);
                      local_810 = ZEXT416(*(uint *)(ray + sVar111 * 4 + 0x200));
                      local_7c0._0_8_ = pGVar107;
                      local_7e8 = lVar105;
                      local_7a0 = local_560;
                      local_53c = iVar15;
                      local_530 = auVar32;
                      local_520 = uVar33;
                      uStack_518 = uVar37;
                      local_510 = uVar95;
                      uStack_508 = uVar96;
                      local_500 = uVar97;
                      uStack_4f8 = uVar98;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_4e0[uVar102]));
                        local_1c0 = vbroadcastss_avx512f
                                              (ZEXT416(*(uint *)(local_4c0 + uVar102 * 4)));
                        *(undefined4 *)(ray + sVar111 * 4 + 0x200) =
                             *(undefined4 *)(local_4a0 + uVar102 * 4);
                        local_840.context = context->user;
                        fVar174 = local_200._0_4_;
                        fVar190 = 1.0 - fVar174;
                        auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar174 * (fVar190 + fVar190))),
                                                  ZEXT416((uint)fVar190),ZEXT416((uint)fVar190));
                        auVar176 = local_200._0_16_;
                        auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar176,
                                                   ZEXT416(0xc0a00000));
                        auVar120 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174 * 3.0)),
                                                   ZEXT416((uint)(fVar174 + fVar174)),auVar119);
                        auVar225 = ZEXT1664(auVar120);
                        auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar176,
                                                   ZEXT416(0x40000000));
                        auVar119 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * -3.0)),
                                                   ZEXT416((uint)(fVar190 + fVar190)),auVar119);
                        auVar176 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174)),auVar176,
                                                   ZEXT416((uint)(fVar190 * -2.0)));
                        fVar190 = auVar8._0_4_ * 0.5;
                        fVar174 = auVar120._0_4_ * 0.5;
                        fVar187 = auVar119._0_4_ * 0.5;
                        fVar188 = auVar176._0_4_ * 0.5;
                        auVar204._0_4_ = fVar188 * local_8a0;
                        auVar204._4_4_ = fVar188 * fStack_89c;
                        auVar204._8_4_ = fVar188 * fStack_898;
                        auVar204._12_4_ = fVar188 * fStack_894;
                        auVar220._4_4_ = fVar187;
                        auVar220._0_4_ = fVar187;
                        auVar220._8_4_ = fVar187;
                        auVar220._12_4_ = fVar187;
                        auVar119 = vfmadd132ps_fma(auVar220,auVar204,auVar11);
                        auVar205._4_4_ = fVar174;
                        auVar205._0_4_ = fVar174;
                        auVar205._8_4_ = fVar174;
                        auVar205._12_4_ = fVar174;
                        auVar119 = vfmadd132ps_fma(auVar205,auVar119,auVar12);
                        auVar177._4_4_ = fVar190;
                        auVar177._0_4_ = fVar190;
                        auVar177._8_4_ = fVar190;
                        auVar177._12_4_ = fVar190;
                        auVar119 = vfmadd213ps_fma(auVar177,auVar32,auVar119);
                        auVar186 = vbroadcastss_avx512f(auVar119);
                        auVar217 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar217 = vpermps_avx512f(auVar217,ZEXT1664(auVar119));
                        auVar222 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar222,ZEXT1664(auVar119));
                        local_2c0[0] = (RTCHitN)auVar186[0];
                        local_2c0[1] = (RTCHitN)auVar186[1];
                        local_2c0[2] = (RTCHitN)auVar186[2];
                        local_2c0[3] = (RTCHitN)auVar186[3];
                        local_2c0[4] = (RTCHitN)auVar186[4];
                        local_2c0[5] = (RTCHitN)auVar186[5];
                        local_2c0[6] = (RTCHitN)auVar186[6];
                        local_2c0[7] = (RTCHitN)auVar186[7];
                        local_2c0[8] = (RTCHitN)auVar186[8];
                        local_2c0[9] = (RTCHitN)auVar186[9];
                        local_2c0[10] = (RTCHitN)auVar186[10];
                        local_2c0[0xb] = (RTCHitN)auVar186[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar186[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar186[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar186[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar186[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar186[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar186[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar186[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar186[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar186[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar186[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar186[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar186[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar186[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar186[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar186[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar186[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar186[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar186[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar186[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar186[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar186[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar186[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar186[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar186[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar186[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar186[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar186[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar186[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar186[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar186[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar186[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar186[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar186[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar186[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar186[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar186[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar186[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar186[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar186[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar186[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar186[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar186[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar186[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar186[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar186[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar186[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar186[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar186[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar186[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar186[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar186[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar186[0x3f];
                        local_280 = auVar217;
                        local_180 = local_340._0_8_;
                        uStack_178 = local_340._8_8_;
                        uStack_170 = local_340._16_8_;
                        uStack_168 = local_340._24_8_;
                        uStack_160 = local_340._32_8_;
                        uStack_158 = local_340._40_8_;
                        uStack_150 = local_340._48_8_;
                        uStack_148 = local_340._56_8_;
                        auVar186 = vmovdqa64_avx512f(local_300);
                        local_140 = vmovdqa64_avx512f(auVar186);
                        auVar128 = vpcmpeqd_avx2(auVar186._0_32_,auVar186._0_32_);
                        local_7f0[3] = auVar128;
                        local_7f0[2] = auVar128;
                        local_7f0[1] = auVar128;
                        *local_7f0 = auVar128;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instPrimID[0]))
                        ;
                        auVar186 = vmovdqa64_avx512f(local_380);
                        local_700 = vmovdqa64_avx512f(auVar186);
                        local_840.valid = (int *)local_700;
                        local_840.geometryUserPtr = pGVar107->userPtr;
                        local_840.hit = local_2c0;
                        local_840.N = 0x10;
                        local_840.ray = (RTCRayN *)ray;
                        if (pGVar107->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar217 = ZEXT1664(auVar217._0_16_);
                          auVar222 = ZEXT1664(auVar222._0_16_);
                          auVar225 = ZEXT1664(auVar120);
                          (*pGVar107->intersectionFilterN)(&local_840);
                          auVar230 = ZEXT3264(local_7a0);
                          auVar186 = vmovdqa64_avx512f(local_700);
                          pGVar107 = (Geometry *)local_7c0._0_8_;
                        }
                        uVar34 = vptestmd_avx512f(auVar186,auVar186);
                        if ((short)uVar34 == 0) {
LAB_01a5b546:
                          *(undefined4 *)(ray + sVar111 * 4 + 0x200) = local_810._0_4_;
                        }
                        else {
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar107->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar217 = ZEXT1664(auVar217._0_16_);
                            auVar222 = ZEXT1664(auVar222._0_16_);
                            auVar225 = ZEXT1664(auVar225._0_16_);
                            (*p_Var17)(&local_840);
                            auVar230 = ZEXT3264(local_7a0);
                            auVar186 = vmovdqa64_avx512f(local_700);
                            pGVar107 = (Geometry *)local_7c0._0_8_;
                          }
                          uVar36 = vptestmd_avx512f(auVar186,auVar186);
                          if ((short)uVar36 == 0) goto LAB_01a5b546;
                          iVar1 = *(int *)(local_840.hit + 4);
                          iVar2 = *(int *)(local_840.hit + 8);
                          iVar82 = *(int *)(local_840.hit + 0xc);
                          iVar83 = *(int *)(local_840.hit + 0x10);
                          iVar84 = *(int *)(local_840.hit + 0x14);
                          iVar85 = *(int *)(local_840.hit + 0x18);
                          iVar86 = *(int *)(local_840.hit + 0x1c);
                          iVar87 = *(int *)(local_840.hit + 0x20);
                          iVar88 = *(int *)(local_840.hit + 0x24);
                          iVar89 = *(int *)(local_840.hit + 0x28);
                          iVar90 = *(int *)(local_840.hit + 0x2c);
                          iVar91 = *(int *)(local_840.hit + 0x30);
                          iVar92 = *(int *)(local_840.hit + 0x34);
                          iVar93 = *(int *)(local_840.hit + 0x38);
                          iVar94 = *(int *)(local_840.hit + 0x3c);
                          bVar112 = (byte)uVar36;
                          bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar101 = (byte)(uVar36 >> 8);
                          bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar31 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x300) =
                               (uint)(bVar112 & 1) * *(int *)local_840.hit |
                               (uint)!(bool)(bVar112 & 1) * *(int *)(local_840.ray + 0x300);
                          *(uint *)(local_840.ray + 0x304) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x304);
                          *(uint *)(local_840.ray + 0x308) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x308);
                          *(uint *)(local_840.ray + 0x30c) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x30c);
                          *(uint *)(local_840.ray + 0x310) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x310);
                          *(uint *)(local_840.ray + 0x314) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x314);
                          *(uint *)(local_840.ray + 0x318) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x318);
                          *(uint *)(local_840.ray + 0x31c) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x31c);
                          *(uint *)(local_840.ray + 800) =
                               (uint)(bVar101 & 1) * iVar87 |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_840.ray + 800);
                          *(uint *)(local_840.ray + 0x324) =
                               (uint)bVar25 * iVar88 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x324);
                          *(uint *)(local_840.ray + 0x328) =
                               (uint)bVar26 * iVar89 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x328);
                          *(uint *)(local_840.ray + 0x32c) =
                               (uint)bVar27 * iVar90 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x32c);
                          *(uint *)(local_840.ray + 0x330) =
                               (uint)bVar28 * iVar91 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x330);
                          *(uint *)(local_840.ray + 0x334) =
                               (uint)bVar29 * iVar92 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x334);
                          *(uint *)(local_840.ray + 0x338) =
                               (uint)bVar30 * iVar93 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x338);
                          *(uint *)(local_840.ray + 0x33c) =
                               (uint)bVar31 * iVar94 |
                               (uint)!bVar31 * *(int *)(local_840.ray + 0x33c);
                          iVar1 = *(int *)(local_840.hit + 0x44);
                          iVar2 = *(int *)(local_840.hit + 0x48);
                          iVar82 = *(int *)(local_840.hit + 0x4c);
                          iVar83 = *(int *)(local_840.hit + 0x50);
                          iVar84 = *(int *)(local_840.hit + 0x54);
                          iVar85 = *(int *)(local_840.hit + 0x58);
                          iVar86 = *(int *)(local_840.hit + 0x5c);
                          iVar87 = *(int *)(local_840.hit + 0x60);
                          iVar88 = *(int *)(local_840.hit + 100);
                          iVar89 = *(int *)(local_840.hit + 0x68);
                          iVar90 = *(int *)(local_840.hit + 0x6c);
                          iVar91 = *(int *)(local_840.hit + 0x70);
                          iVar92 = *(int *)(local_840.hit + 0x74);
                          iVar93 = *(int *)(local_840.hit + 0x78);
                          iVar94 = *(int *)(local_840.hit + 0x7c);
                          bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar31 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x340) =
                               (uint)(bVar112 & 1) * *(int *)(local_840.hit + 0x40) |
                               (uint)!(bool)(bVar112 & 1) * *(int *)(local_840.ray + 0x340);
                          *(uint *)(local_840.ray + 0x344) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x344);
                          *(uint *)(local_840.ray + 0x348) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x348);
                          *(uint *)(local_840.ray + 0x34c) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x34c);
                          *(uint *)(local_840.ray + 0x350) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x350);
                          *(uint *)(local_840.ray + 0x354) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x354);
                          *(uint *)(local_840.ray + 0x358) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x358);
                          *(uint *)(local_840.ray + 0x35c) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x35c);
                          *(uint *)(local_840.ray + 0x360) =
                               (uint)(bVar101 & 1) * iVar87 |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_840.ray + 0x360);
                          *(uint *)(local_840.ray + 0x364) =
                               (uint)bVar25 * iVar88 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x364);
                          *(uint *)(local_840.ray + 0x368) =
                               (uint)bVar26 * iVar89 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x368);
                          *(uint *)(local_840.ray + 0x36c) =
                               (uint)bVar27 * iVar90 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x36c);
                          *(uint *)(local_840.ray + 0x370) =
                               (uint)bVar28 * iVar91 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x370);
                          *(uint *)(local_840.ray + 0x374) =
                               (uint)bVar29 * iVar92 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x374);
                          *(uint *)(local_840.ray + 0x378) =
                               (uint)bVar30 * iVar93 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x378);
                          *(uint *)(local_840.ray + 0x37c) =
                               (uint)bVar31 * iVar94 |
                               (uint)!bVar31 * *(int *)(local_840.ray + 0x37c);
                          iVar1 = *(int *)(local_840.hit + 0x84);
                          iVar2 = *(int *)(local_840.hit + 0x88);
                          iVar82 = *(int *)(local_840.hit + 0x8c);
                          iVar83 = *(int *)(local_840.hit + 0x90);
                          iVar84 = *(int *)(local_840.hit + 0x94);
                          iVar85 = *(int *)(local_840.hit + 0x98);
                          iVar86 = *(int *)(local_840.hit + 0x9c);
                          iVar87 = *(int *)(local_840.hit + 0xa0);
                          iVar88 = *(int *)(local_840.hit + 0xa4);
                          iVar89 = *(int *)(local_840.hit + 0xa8);
                          iVar90 = *(int *)(local_840.hit + 0xac);
                          iVar91 = *(int *)(local_840.hit + 0xb0);
                          iVar92 = *(int *)(local_840.hit + 0xb4);
                          iVar93 = *(int *)(local_840.hit + 0xb8);
                          iVar94 = *(int *)(local_840.hit + 0xbc);
                          bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar31 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x380) =
                               (uint)(bVar112 & 1) * *(int *)(local_840.hit + 0x80) |
                               (uint)!(bool)(bVar112 & 1) * *(int *)(local_840.ray + 0x380);
                          *(uint *)(local_840.ray + 900) =
                               (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_840.ray + 900);
                          *(uint *)(local_840.ray + 0x388) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x388);
                          *(uint *)(local_840.ray + 0x38c) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x38c);
                          *(uint *)(local_840.ray + 0x390) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x390);
                          *(uint *)(local_840.ray + 0x394) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x394);
                          *(uint *)(local_840.ray + 0x398) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x398);
                          *(uint *)(local_840.ray + 0x39c) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x39c);
                          *(uint *)(local_840.ray + 0x3a0) =
                               (uint)(bVar101 & 1) * iVar87 |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_840.ray + 0x3a0);
                          *(uint *)(local_840.ray + 0x3a4) =
                               (uint)bVar25 * iVar88 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x3a4);
                          *(uint *)(local_840.ray + 0x3a8) =
                               (uint)bVar26 * iVar89 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x3a8);
                          *(uint *)(local_840.ray + 0x3ac) =
                               (uint)bVar27 * iVar90 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x3ac);
                          *(uint *)(local_840.ray + 0x3b0) =
                               (uint)bVar28 * iVar91 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x3b0);
                          *(uint *)(local_840.ray + 0x3b4) =
                               (uint)bVar29 * iVar92 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x3b4);
                          *(uint *)(local_840.ray + 0x3b8) =
                               (uint)bVar30 * iVar93 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x3b8);
                          *(uint *)(local_840.ray + 0x3bc) =
                               (uint)bVar31 * iVar94 |
                               (uint)!bVar31 * *(int *)(local_840.ray + 0x3bc);
                          iVar1 = *(int *)(local_840.hit + 0xc4);
                          iVar2 = *(int *)(local_840.hit + 200);
                          iVar82 = *(int *)(local_840.hit + 0xcc);
                          iVar83 = *(int *)(local_840.hit + 0xd0);
                          iVar84 = *(int *)(local_840.hit + 0xd4);
                          iVar85 = *(int *)(local_840.hit + 0xd8);
                          iVar86 = *(int *)(local_840.hit + 0xdc);
                          iVar87 = *(int *)(local_840.hit + 0xe0);
                          iVar88 = *(int *)(local_840.hit + 0xe4);
                          iVar89 = *(int *)(local_840.hit + 0xe8);
                          iVar90 = *(int *)(local_840.hit + 0xec);
                          iVar91 = *(int *)(local_840.hit + 0xf0);
                          iVar92 = *(int *)(local_840.hit + 0xf4);
                          iVar93 = *(int *)(local_840.hit + 0xf8);
                          iVar94 = *(int *)(local_840.hit + 0xfc);
                          bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar31 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x3c0) =
                               (uint)(bVar112 & 1) * *(int *)(local_840.hit + 0xc0) |
                               (uint)!(bool)(bVar112 & 1) * *(int *)(local_840.ray + 0x3c0);
                          *(uint *)(local_840.ray + 0x3c4) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x3c4);
                          *(uint *)(local_840.ray + 0x3c8) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x3c8);
                          *(uint *)(local_840.ray + 0x3cc) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x3cc);
                          *(uint *)(local_840.ray + 0x3d0) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x3d0);
                          *(uint *)(local_840.ray + 0x3d4) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x3d4);
                          *(uint *)(local_840.ray + 0x3d8) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x3d8);
                          *(uint *)(local_840.ray + 0x3dc) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x3dc);
                          *(uint *)(local_840.ray + 0x3e0) =
                               (uint)(bVar101 & 1) * iVar87 |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_840.ray + 0x3e0);
                          *(uint *)(local_840.ray + 0x3e4) =
                               (uint)bVar25 * iVar88 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x3e4);
                          *(uint *)(local_840.ray + 1000) =
                               (uint)bVar26 * iVar89 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 1000);
                          *(uint *)(local_840.ray + 0x3ec) =
                               (uint)bVar27 * iVar90 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x3ec);
                          *(uint *)(local_840.ray + 0x3f0) =
                               (uint)bVar28 * iVar91 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x3f0);
                          *(uint *)(local_840.ray + 0x3f4) =
                               (uint)bVar29 * iVar92 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x3f4);
                          *(uint *)(local_840.ray + 0x3f8) =
                               (uint)bVar30 * iVar93 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x3f8);
                          *(uint *)(local_840.ray + 0x3fc) =
                               (uint)bVar31 * iVar94 |
                               (uint)!bVar31 * *(int *)(local_840.ray + 0x3fc);
                          iVar1 = *(int *)(local_840.hit + 0x104);
                          iVar2 = *(int *)(local_840.hit + 0x108);
                          iVar82 = *(int *)(local_840.hit + 0x10c);
                          iVar83 = *(int *)(local_840.hit + 0x110);
                          iVar84 = *(int *)(local_840.hit + 0x114);
                          iVar85 = *(int *)(local_840.hit + 0x118);
                          iVar86 = *(int *)(local_840.hit + 0x11c);
                          iVar87 = *(int *)(local_840.hit + 0x120);
                          iVar88 = *(int *)(local_840.hit + 0x124);
                          iVar89 = *(int *)(local_840.hit + 0x128);
                          iVar90 = *(int *)(local_840.hit + 300);
                          iVar91 = *(int *)(local_840.hit + 0x130);
                          iVar92 = *(int *)(local_840.hit + 0x134);
                          iVar93 = *(int *)(local_840.hit + 0x138);
                          iVar94 = *(int *)(local_840.hit + 0x13c);
                          bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar31 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x400) =
                               (uint)(bVar112 & 1) * *(int *)(local_840.hit + 0x100) |
                               (uint)!(bool)(bVar112 & 1) * *(int *)(local_840.ray + 0x400);
                          *(uint *)(local_840.ray + 0x404) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x404);
                          *(uint *)(local_840.ray + 0x408) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x408);
                          *(uint *)(local_840.ray + 0x40c) =
                               (uint)bVar20 * iVar82 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x40c);
                          *(uint *)(local_840.ray + 0x410) =
                               (uint)bVar21 * iVar83 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x410);
                          *(uint *)(local_840.ray + 0x414) =
                               (uint)bVar22 * iVar84 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x414);
                          *(uint *)(local_840.ray + 0x418) =
                               (uint)bVar23 * iVar85 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x418);
                          *(uint *)(local_840.ray + 0x41c) =
                               (uint)bVar24 * iVar86 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x41c);
                          *(uint *)(local_840.ray + 0x420) =
                               (uint)(bVar101 & 1) * iVar87 |
                               (uint)!(bool)(bVar101 & 1) * *(int *)(local_840.ray + 0x420);
                          *(uint *)(local_840.ray + 0x424) =
                               (uint)bVar25 * iVar88 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x424);
                          *(uint *)(local_840.ray + 0x428) =
                               (uint)bVar26 * iVar89 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x428);
                          *(uint *)(local_840.ray + 0x42c) =
                               (uint)bVar27 * iVar90 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x42c);
                          *(uint *)(local_840.ray + 0x430) =
                               (uint)bVar28 * iVar91 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x430);
                          *(uint *)(local_840.ray + 0x434) =
                               (uint)bVar29 * iVar92 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x434);
                          *(uint *)(local_840.ray + 0x438) =
                               (uint)bVar30 * iVar93 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x438);
                          *(uint *)(local_840.ray + 0x43c) =
                               (uint)bVar31 * iVar94 |
                               (uint)!bVar31 * *(int *)(local_840.ray + 0x43c);
                          auVar186 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x140)
                                                      );
                          auVar186 = vmovdqu32_avx512f(auVar186);
                          *(undefined1 (*) [64])(local_840.ray + 0x440) = auVar186;
                          auVar186 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x180)
                                                      );
                          auVar186 = vmovdqu32_avx512f(auVar186);
                          *(undefined1 (*) [64])(local_840.ray + 0x480) = auVar186;
                          auVar186 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x1c0)
                                                      );
                          auVar186 = vmovdqa32_avx512f(auVar186);
                          *(undefined1 (*) [64])(local_840.ray + 0x4c0) = auVar186;
                          auVar186 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x200)
                                                      );
                          auVar186 = vmovdqa32_avx512f(auVar186);
                          *(undefined1 (*) [64])(local_840.ray + 0x500) = auVar186;
                          local_810._0_4_ = *(undefined4 *)(ray + sVar111 * 4 + 0x200);
                          local_810._4_4_ = 0;
                          local_810._8_4_ = 0;
                          local_810._12_4_ = 0;
                        }
                        bVar112 = ~(byte)(1 << ((uint)uVar102 & 0x1f)) & (byte)uVar109;
                        auVar182._4_4_ = local_810._0_4_;
                        auVar182._0_4_ = local_810._0_4_;
                        auVar182._8_4_ = local_810._0_4_;
                        auVar182._12_4_ = local_810._0_4_;
                        auVar182._16_4_ = local_810._0_4_;
                        auVar182._20_4_ = local_810._0_4_;
                        auVar182._24_4_ = local_810._0_4_;
                        auVar182._28_4_ = local_810._0_4_;
                        uVar34 = vcmpps_avx512vl(auVar230._0_32_,auVar182,2);
                        if ((bVar112 & (byte)uVar34) == 0) goto LAB_01a5b5e6;
                        bVar112 = bVar112 & (byte)uVar34;
                        uVar109 = (ulong)bVar112;
                        auVar183._8_4_ = 0x7f800000;
                        auVar183._0_8_ = 0x7f8000007f800000;
                        auVar183._12_4_ = 0x7f800000;
                        auVar183._16_4_ = 0x7f800000;
                        auVar183._20_4_ = 0x7f800000;
                        auVar183._24_4_ = 0x7f800000;
                        auVar183._28_4_ = 0x7f800000;
                        auVar128 = vblendmps_avx512vl(auVar183,auVar230._0_32_);
                        auVar163._0_4_ =
                             (uint)(bVar112 & 1) * auVar128._0_4_ |
                             (uint)!(bool)(bVar112 & 1) * 0x7f800000;
                        bVar18 = (bool)(bVar112 >> 1 & 1);
                        auVar163._4_4_ = (uint)bVar18 * auVar128._4_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar112 >> 2 & 1);
                        auVar163._8_4_ = (uint)bVar18 * auVar128._8_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar112 >> 3 & 1);
                        auVar163._12_4_ =
                             (uint)bVar18 * auVar128._12_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar112 >> 4 & 1);
                        auVar163._16_4_ =
                             (uint)bVar18 * auVar128._16_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar112 >> 5 & 1);
                        auVar163._20_4_ =
                             (uint)bVar18 * auVar128._20_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar112 >> 6 & 1);
                        auVar163._24_4_ =
                             (uint)bVar18 * auVar128._24_4_ | (uint)!bVar18 * 0x7f800000;
                        auVar163._28_4_ =
                             (uint)(bVar112 >> 7) * auVar128._28_4_ |
                             (uint)!(bool)(bVar112 >> 7) * 0x7f800000;
                        auVar128 = vshufps_avx(auVar163,auVar163,0xb1);
                        auVar128 = vminps_avx(auVar163,auVar128);
                        auVar126 = vshufpd_avx(auVar128,auVar128,5);
                        auVar128 = vminps_avx(auVar128,auVar126);
                        auVar126 = vpermpd_avx2(auVar128,0x4e);
                        auVar128 = vminps_avx(auVar128,auVar126);
                        uVar34 = vcmpps_avx512vl(auVar163,auVar128,0);
                        bVar101 = (byte)uVar34 & bVar112;
                        if (bVar101 != 0) {
                          bVar112 = bVar101;
                        }
                        uVar103 = 0;
                        for (uVar104 = (uint)bVar112; (uVar104 & 1) == 0;
                            uVar104 = uVar104 >> 1 | 0x80000000) {
                          uVar103 = uVar103 + 1;
                        }
                        uVar102 = (ulong)uVar103;
                      } while( true );
                    }
                    fVar190 = local_4e0[uVar102];
                    uVar175 = *(undefined4 *)(local_4c0 + uVar102 * 4);
                    fVar174 = 1.0 - fVar190;
                    auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar190 * (fVar174 + fVar174))),
                                              ZEXT416((uint)fVar174),ZEXT416((uint)fVar174));
                    auVar176 = ZEXT416((uint)fVar190);
                    auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar176,
                                               ZEXT416(0xc0a00000));
                    auVar120 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * 3.0)),
                                               ZEXT416((uint)(fVar190 + fVar190)),auVar119);
                    auVar225 = ZEXT1664(auVar120);
                    auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar176,
                                               ZEXT416(0x40000000));
                    auVar119 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174 * -3.0)),
                                               ZEXT416((uint)(fVar174 + fVar174)),auVar119);
                    auVar176 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),auVar176,
                                               ZEXT416((uint)(fVar174 * -2.0)));
                    fVar174 = auVar8._0_4_ * 0.5;
                    fVar187 = auVar120._0_4_ * 0.5;
                    auVar217 = ZEXT464((uint)fVar187);
                    fVar188 = auVar119._0_4_ * 0.5;
                    fVar197 = auVar176._0_4_ * 0.5;
                    auVar202._0_4_ = fVar197 * local_8a0;
                    auVar202._4_4_ = fVar197 * fStack_89c;
                    auVar202._8_4_ = fVar197 * fStack_898;
                    auVar202._12_4_ = fVar197 * fStack_894;
                    auVar219._4_4_ = fVar188;
                    auVar219._0_4_ = fVar188;
                    auVar219._8_4_ = fVar188;
                    auVar219._12_4_ = fVar188;
                    auVar119 = vfmadd132ps_fma(auVar219,auVar202,auVar9);
                    auVar222 = ZEXT1664(auVar119);
                    auVar203._4_4_ = fVar187;
                    auVar203._0_4_ = fVar187;
                    auVar203._8_4_ = fVar187;
                    auVar203._12_4_ = fVar187;
                    auVar119 = vfmadd132ps_fma(auVar203,auVar119,auVar10);
                    auVar192._4_4_ = fVar174;
                    auVar192._0_4_ = fVar174;
                    auVar192._8_4_ = fVar174;
                    auVar192._12_4_ = fVar174;
                    auVar119 = vfmadd213ps_fma(auVar192,auVar32,auVar119);
                    *(undefined4 *)(ray + sVar111 * 4 + 0x200) =
                         *(undefined4 *)(local_4a0 + uVar102 * 4);
                    *(int *)(ray + sVar111 * 4 + 0x300) = auVar119._0_4_;
                    uVar16 = vextractps_avx(auVar119,1);
                    *(undefined4 *)(ray + sVar111 * 4 + 0x340) = uVar16;
                    uVar16 = vextractps_avx(auVar119,2);
                    *(undefined4 *)(ray + sVar111 * 4 + 0x380) = uVar16;
                    *(float *)(ray + sVar111 * 4 + 0x3c0) = fVar190;
                    *(undefined4 *)(ray + sVar111 * 4 + 0x400) = uVar175;
                    *(uint *)(ray + sVar111 * 4 + 0x440) = uVar14;
                    *(uint *)(ray + sVar111 * 4 + 0x480) = uVar13;
                    *(uint *)(ray + sVar111 * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + sVar111 * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01a5b1b6;
      }
    }
    uVar175 = *(undefined4 *)(ray + sVar111 * 4 + 0x200);
    auVar43._4_4_ = uVar175;
    auVar43._0_4_ = uVar175;
    auVar43._8_4_ = uVar175;
    auVar43._12_4_ = uVar175;
    auVar43._16_4_ = uVar175;
    auVar43._20_4_ = uVar175;
    auVar43._24_4_ = uVar175;
    auVar43._28_4_ = uVar175;
    uVar33 = vcmpps_avx512vl(local_3a0,auVar43,2);
    uVar108 = (ulong)((uint)uVar108 & (uint)uVar33);
  } while( true );
LAB_01a5b5e6:
  auVar239 = ZEXT3264(local_760);
  auVar240 = ZEXT3264(local_780);
  auVar128 = vmovdqa64_avx512vl(local_460);
  auVar186 = ZEXT3264(auVar128);
  lVar105 = local_7e8;
LAB_01a5b1b6:
  lVar106 = lVar106 + 8;
  goto LAB_01a5a8ba;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }